

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void * bb_version_generator(gen_ctx_t gen_ctx,bb_version_t_conflict bb_version)

{
  undefined8 *puVar1;
  VARR_target_bb_version_t *pVVar2;
  target_ctx *ptVar3;
  VARR_uint8_t *pVVar4;
  VARR_uint64_t *pVVar5;
  VARR_const_ref_t *pVVar6;
  VARR_label_ref_t *pVVar7;
  undefined8 *puVar8;
  long *plVar9;
  undefined8 uVar10;
  uint32_t *puVar11;
  MIR_op_t *pMVar12;
  MIR_context_t ctx;
  bitmap_el_t *pbVar13;
  bitmap_el_t bVar14;
  size_t *psVar15;
  lr_ctx *plVar16;
  live_range_t_conflict __ptr;
  lr_bb_t_conflict __ptr_00;
  gen_ctx *pgVar17;
  bool bVar18;
  byte bVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  bool bVar22;
  uint uVar23;
  int iVar24;
  VARR_expr_t *pVVar25;
  VARR_allocno_info_t *pVVar26;
  VARR_bitmap_t *pVVar27;
  MIR_func_t pMVar28;
  void *pvVar29;
  bitmap_t pVVar30;
  bitmap_t extraout_RAX;
  ra_ctx *prVar31;
  ulong *puVar32;
  bitmap_t extraout_RAX_00;
  void *extraout_RAX_01;
  VARR_call_ref_t *pVVar33;
  void *extraout_RAX_02;
  void *extraout_RAX_03;
  ulong uVar34;
  dead_var_t_conflict *ppdVar35;
  VARR_lr_gap_t *pVVar36;
  undefined1 *puVar37;
  long lVar38;
  ulong *puVar39;
  void **jump_addrs;
  DLIST_dead_var_t *pDVar40;
  char *pcVar41;
  uint uVar42;
  ulong uVar43;
  long lVar44;
  ra_ctx *prVar45;
  ra_ctx *prVar46;
  spot_attr_t *attr;
  uint8_t *puVar47;
  ra_ctx *prVar48;
  ra_ctx *prVar49;
  gen_ctx *pgVar50;
  ra_ctx *ctx_00;
  ra_ctx *__ptr_01;
  ra_ctx *ctx_01;
  ra_ctx *prVar51;
  ulong uVar52;
  ra_ctx *in_R9;
  ra_ctx *unaff_R13;
  uint8_t **ppuVar53;
  _IO_FILE *p_Var54;
  bitmap_el_t bVar55;
  size_t sVar56;
  ra_ctx *unaff_R15;
  size_t __size;
  uint8_t *puVar57;
  bool bVar58;
  void *addr;
  int iStack_16c;
  gen_ctx *pgStack_168;
  ra_ctx *prStack_160;
  uint8_t *puStack_158;
  ra_ctx *prStack_150;
  ra_ctx *prStack_148;
  ra_ctx *prStack_140;
  gen_ctx *pgStack_138;
  ra_ctx *prStack_130;
  ra_ctx *prStack_128;
  ra_ctx *prStack_120;
  ra_ctx *prStack_118;
  ra_ctx *prStack_110;
  ra_ctx *prStack_108;
  ra_ctx *prStack_100;
  VARR_bitmap_t *pVStack_f8;
  VARR_MIR_proto_t *pVStack_f0;
  VARR_lr_gap_t *local_e8;
  VARR_lr_gap_t *pVStack_e0;
  bitmap_t pVStack_d8;
  HTAB_MIR_item_t *pHStack_d0;
  ra_ctx *local_c8;
  ra_ctx *local_c0;
  ra_ctx *local_b8;
  ra_ctx *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [72];
  bitmap_t pVStack_50;
  bitmap_t pVStack_48;
  anon_union_8_2_369d9a33_for_u aStack_40;
  bitmap_t local_38;
  
  prVar31 = (ra_ctx *)gen_ctx->temp_bitmap;
  if ((prVar31 == (ra_ctx *)0x0) || (prVar31->sorted_regs == (VARR_allocno_info_t *)0x0))
  goto LAB_00152f6c;
  local_b8 = (ra_ctx *)gen_ctx->ctx;
  local_98._16_8_ = bb_version->bb_stub;
  *(ulong *)prVar31 = 0;
  local_98._40_8_ = bb_version;
  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    prStack_100 = (ra_ctx *)0x1518fc;
    fprintf((FILE *)gen_ctx->debug_file,"  IN BBStub%llx nonzero properties: ",local_98._16_8_);
  }
  if (*(uint32_t *)(local_98._40_8_ + 0x58) != 0) {
    prVar46 = (ra_ctx *)(local_98._40_8_ + 0x60);
    unaff_R15 = (ra_ctx *)0x0;
    local_b0 = prVar46;
    do {
      local_c0 = (ra_ctx *)(ulong)*(uint *)(prVar46->lr_gap_bitmaps + (long)unaff_R15 * 2 + -8);
      uVar43 = (ulong)local_c0->lr_gap_bitmaps >> 6;
      lVar44 = uVar43 - *(ulong *)prVar31;
      if (*(ulong *)prVar31 <= uVar43 && lVar44 != 0) {
        do {
          if (prVar31->sorted_regs == (VARR_allocno_info_t *)0x0) {
            prStack_100 = (ra_ctx *)0x152ef3;
            bb_version_generator_cold_1();
            goto LAB_00152ef3;
          }
          pVVar25 = (VARR_expr_t *)(*(ulong *)prVar31 + 1);
          if ((VARR_expr_t *)prVar31->reg_renumber < pVVar25) {
            unaff_R13 = (ra_ctx *)((long)&pVVar25->els_num + ((ulong)pVVar25 >> 1));
            prStack_100 = (ra_ctx *)0x151971;
            pVVar26 = (VARR_allocno_info_t *)realloc(prVar31->sorted_regs,(long)unaff_R13 * 8);
            prVar31->sorted_regs = pVVar26;
            prVar31->reg_renumber = (VARR_MIR_reg_t *)unaff_R13;
          }
          uVar43 = *(ulong *)prVar31;
          *(ulong *)prVar31 = uVar43 + 1;
          (&prVar31->sorted_regs->els_num)[uVar43] = 0;
          lVar44 = lVar44 + -1;
        } while (lVar44 != 0);
      }
      prVar46 = local_b0;
      attr = (spot_attr_t *)(local_b0->lr_gap_bitmaps + (long)unaff_R15 * 2 + -8);
      psVar15 = &prVar31->sorted_regs->els_num + ((ulong)local_c0 >> 6 & 0x3ffffff);
      *psVar15 = *psVar15 | 1L << ((ulong)local_c0 & 0x3f);
      prStack_100 = (ra_ctx *)0x1519c9;
      set_spot2attr(gen_ctx,attr);
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        if (unaff_R15 != (ra_ctx *)0x0) {
          prStack_100 = (ra_ctx *)0x1519f4;
          fwrite(", ",2,1,(FILE *)gen_ctx->debug_file);
        }
        prStack_100 = (ra_ctx *)0x151a0c;
        fprintf((FILE *)gen_ctx->debug_file,"(spot=%u,prop=%u)",(ulong)attr->spot,(ulong)attr->prop)
        ;
      }
      unaff_R15 = (ra_ctx *)((long)&unaff_R15->start_mem_loc + 1);
    } while (unaff_R15 < (ra_ctx *)(ulong)*(uint32_t *)(local_98._40_8_ + 0x58));
  }
  prVar46 = (ra_ctx *)gen_ctx->debug_file;
  if ((prVar46 != (ra_ctx *)0x0) && (1 < gen_ctx->debug_level)) {
    prStack_100 = (ra_ctx *)0x151a3d;
    fputc(10,(FILE *)prVar46);
  }
  if (*(uint32_t *)(local_98._40_8_ + 0x58) == 0) {
    local_98._32_8_ = (VARR_lr_gap_t *)0x0;
  }
  else {
    local_98._32_8_ =
         ZEXT48(((spot_attr_t *)(local_98._40_8_ + 0x60))[*(uint32_t *)(local_98._40_8_ + 0x58) - 1]
                .spot);
  }
  pVVar2 = gen_ctx->target_succ_bb_versions;
  if ((pVVar2 == (VARR_target_bb_version_t *)0x0) || (pVVar2->varr == (target_bb_version_t *)0x0))
  goto LAB_00152f71;
  pVVar2->els_num = 0;
  ptVar3 = gen_ctx->target_ctx;
  pVVar4 = ptVar3->result_code;
  if ((pVVar4 == (VARR_uint8_t *)0x0) || (pVVar4->varr == (uint8_t *)0x0)) goto LAB_00152f76;
  pVVar4->els_num = 0;
  pVVar5 = ptVar3->const_pool;
  if ((pVVar5 == (VARR_uint64_t *)0x0) || (pVVar5->varr == (uint64_t *)0x0)) goto LAB_00152f7b;
  pVVar5->els_num = 0;
  pVVar6 = ptVar3->const_refs;
  if ((pVVar6 == (VARR_const_ref_t *)0x0) || (pVVar6->varr == (const_ref_t *)0x0))
  goto LAB_00152f80;
  pVVar6->els_num = 0;
  pVVar7 = ptVar3->label_refs;
  if ((pVVar7 == (VARR_label_ref_t *)0x0) || (pVVar7->varr == (label_ref_t *)0x0))
  goto LAB_00152f85;
  pVVar7->els_num = 0;
  pVVar5 = ptVar3->abs_address_locs;
  if ((pVVar5 != (VARR_uint64_t *)0x0) && (pVVar5->varr != (uint64_t *)0x0)) {
    pVVar5->els_num = 0;
    prVar48 = *(ra_ctx **)(local_98._16_8_ + 0x18);
    local_a8._8_8_ = &prVar48->used_locs;
    pVVar27 = prVar48->used_locs;
    local_b0 = (ra_ctx *)gen_ctx;
    if (0xffffffd0 < (int)pVVar27 - 0xa5U) {
LAB_00152540:
      puVar8 = *(undefined8 **)&((ra_ctx *)gen_ctx)->out_reloads[1].var;
      if ((puVar8 != (undefined8 *)0x0) && (puVar8[2] != 0)) {
        *puVar8 = 0;
        ctx_00 = (ra_ctx *)((ra_ctx *)gen_ctx)->used_locs;
        if ((ctx_00 != (ra_ctx *)0x0) && (1 < *(int *)&((ra_ctx *)gen_ctx)->busy_used_locs)) {
          prStack_100 = (ra_ctx *)0x152588;
          fprintf((FILE *)ctx_00,"  OUT BBStub%llx nonzero properties: ",local_98._16_8_);
          unaff_R15 = in_R9;
        }
        prVar46 = (ra_ctx *)0x0;
        local_c8 = prVar48;
        do {
          prVar45 = local_c8;
          uVar34 = (ulong)prVar46 >> 6;
          uVar43 = *(ulong *)prVar31;
          bVar18 = true;
          prVar49 = prVar46;
          if (uVar34 < uVar43) {
            ctx_00 = (ra_ctx *)prVar31->sorted_regs;
            prVar49 = (ra_ctx *)(uVar43 << 6);
LAB_001525b0:
            if ((ctx_00->lr_gap_bitmaps[uVar34 - 8] == (bitmap_t)0x0) ||
               (uVar52 = (ulong)ctx_00->lr_gap_bitmaps[uVar34 - 8] >> ((ulong)prVar46 & 0x3f),
               uVar52 == 0)) goto LAB_001525c3;
            uVar43 = uVar52 & 1;
            in_R9 = prVar46;
            while (uVar43 == 0) {
              in_R9 = (ra_ctx *)((long)&in_R9->start_mem_loc + 1);
              uVar43 = uVar52 & 2;
              uVar52 = uVar52 >> 1;
            }
            prVar49 = (ra_ctx *)((long)&in_R9->start_mem_loc + 1);
            bVar18 = false;
          }
LAB_001525f7:
          if ((bVar18) ||
             ((0xfffffffc < *(int *)(VARR_bitmap_t **)local_a8._8_8_ - 0xaaU && (0x22 < (uint)in_R9)
              ))) goto LAB_00152738;
          puVar8 = *(undefined8 **)&((ra_ctx *)gen_ctx)->out_reloads[0].hreg;
          if (((puVar8 == (undefined8 *)0x0) || (lVar44 = puVar8[2], lVar44 == 0)) ||
             ((ra_ctx *)*puVar8 <= in_R9)) goto LAB_00152f07;
          unaff_R15 = *(ra_ctx **)(lVar44 + (long)in_R9 * 0x10);
          pMVar12 = *(MIR_op_t **)(lVar44 + (long)in_R9 * 0x10 + 8);
          local_98._0_8_ = unaff_R15;
          local_98._8_8_ = pMVar12;
          if (((FILE *)((ra_ctx *)gen_ctx)->used_locs != (FILE *)0x0) &&
             (1 < *(int *)&((ra_ctx *)gen_ctx)->busy_used_locs)) {
            plVar9 = *(long **)&((ra_ctx *)gen_ctx)->out_reloads[1].var;
            if (plVar9 == (long *)0x0) goto LAB_00152f4e;
            if (*plVar9 != 0) {
              prStack_100 = (ra_ctx *)0x15269b;
              fwrite(", ",2,1,(FILE *)((ra_ctx *)gen_ctx)->used_locs);
            }
            prStack_100 = (ra_ctx *)0x1526b5;
            fprintf((FILE *)((ra_ctx *)gen_ctx)->used_locs,"(spot=%u,prop=%u)",
                    local_98._0_8_ & 0xffffffff,(ulong)local_98._0_8_ >> 0x20);
          }
          unaff_R13 = *(ra_ctx **)&((ra_ctx *)gen_ctx)->out_reloads[1].var;
          ctx_00 = (ra_ctx *)unaff_R13->sorted_regs;
          if (ctx_00 == (ra_ctx *)0x0) goto LAB_00152f3a;
          p_Var54 = (_IO_FILE *)((long)&(*(gen_ctx **)&unaff_R13->start_mem_loc)->ctx + 1);
          if ((_IO_FILE *)unaff_R13->reg_renumber < p_Var54) {
            p_Var54 = (_IO_FILE *)((long)&p_Var54->_flags + ((ulong)p_Var54 >> 1));
            prStack_100 = (ra_ctx *)0x1526f9;
            local_c0 = unaff_R15;
            pVVar26 = (VARR_allocno_info_t *)realloc(ctx_00,(long)p_Var54 * 0x10);
            unaff_R13->sorted_regs = pVVar26;
            unaff_R13->reg_renumber = (VARR_MIR_reg_t *)p_Var54;
            gen_ctx = (gen_ctx_t)local_b0;
            unaff_R15 = local_c0;
          }
          pgVar50 = *(gen_ctx **)&unaff_R13->start_mem_loc;
          pVVar26 = unaff_R13->sorted_regs;
          *(gen_ctx **)&unaff_R13->start_mem_loc = (gen_ctx *)((long)&pgVar50->ctx + 1);
          (&pVVar26->els_num)[(long)pgVar50 * 2] = (size_t)unaff_R15;
          (&pVVar26->size)[(long)pgVar50 * 2] = (size_t)pMVar12;
          prVar46 = prVar49;
        } while( true );
      }
      goto LAB_00152f8f;
    }
    local_98._56_8_ = ZEXT48((int)local_98._32_8_ - 0x22);
    local_38 = (bitmap_t)
               ((ulong)((long)&((VARR_lr_gap_t *)(local_98._56_8_ + 0x60))->els_num + 2U) >> 6);
    ctx_00 = local_b8;
LAB_00151b82:
    prVar49 = (ra_ctx *)prVar48->sorted_regs;
    uVar23 = (uint)pVVar27;
    local_c8 = prVar48;
    if ((int)uVar23 < 0xb6) {
      if (uVar23 < 4) {
        if (*(char *)&prVar48->var_bbs == '\v') {
          iVar24 = *(int *)((long)&prVar48->curr_gaps + 4);
          prVar45 = (ra_ctx *)(ulong)(iVar24 + 0x23);
          if (iVar24 == 0) {
            prVar45 = (ra_ctx *)0x0;
          }
        }
        else {
          prVar45 = (ra_ctx *)0x0;
          if (*(char *)&prVar48->var_bbs == '\x02') {
            prVar45 = (ra_ctx *)(ulong)(*(int *)&prVar48->spill_gaps + 1);
          }
        }
        if (*(char *)(prVar48->lr_gap_bitmaps + 3) == '\v') {
          iVar24 = *(int *)((long)prVar48->lr_gap_bitmaps + 0x2c);
          uVar23 = iVar24 + 0x23;
          if (iVar24 == 0) {
            uVar23 = 0;
          }
        }
        else {
          uVar23 = 0;
          if (*(char *)(prVar48->lr_gap_bitmaps + 3) == '\x02') {
            uVar23 = *(int *)&((DLIST_MIR_item_t *)(prVar48->lr_gap_bitmaps + 4))->head + 1;
          }
        }
        uVar42 = (uint)prVar45;
        if (uVar23 == 0) {
          local_c0 = in_R9;
          local_98._24_8_ = prVar49;
          if (prVar45 < (ra_ctx *)(*(ulong *)prVar31 << 6)) {
            bVar19 = (byte)prVar45 & 0x3f;
            psVar15 = &prVar31->sorted_regs->els_num + ((ulong)prVar45 >> 6);
            *psVar15 = *psVar15 & (-2L << bVar19 | 0xfffffffffffffffeU >> 0x40 - bVar19);
          }
        }
        else if (uVar42 == 0) {
          local_c0 = in_R9;
          local_98._24_8_ = prVar49;
          if (0x22 < (uint)local_98._32_4_) {
            lVar44 = (long)local_38 - *(ulong *)prVar31;
            if (*(bitmap_t *)prVar31 <= local_38 && lVar44 != 0) {
              do {
                if (prVar31->sorted_regs == (VARR_allocno_info_t *)0x0) goto LAB_00152f44;
                pVVar25 = (VARR_expr_t *)(*(ulong *)prVar31 + 1);
                if ((VARR_expr_t *)prVar31->reg_renumber < pVVar25) {
                  unaff_R15 = (ra_ctx *)((long)&pVVar25->els_num + ((ulong)pVVar25 >> 1));
                  prStack_100 = (ra_ctx *)0x151ee5;
                  pVVar26 = (VARR_allocno_info_t *)realloc(prVar31->sorted_regs,(long)unaff_R15 * 8)
                  ;
                  prVar31->sorted_regs = pVVar26;
                  prVar31->reg_renumber = (VARR_MIR_reg_t *)unaff_R15;
                }
                uVar43 = *(ulong *)prVar31;
                *(ulong *)prVar31 = uVar43 + 1;
                (&prVar31->sorted_regs->els_num)[uVar43] = 0;
                lVar44 = lVar44 + -1;
              } while (lVar44 != 0);
            }
            if ((VARR_lr_gap_t *)local_98._56_8_ != (VARR_lr_gap_t *)0x0) {
              pVVar26 = prVar31->sorted_regs;
              uVar43 = 0x23;
              pVVar36 = (VARR_lr_gap_t *)local_98._56_8_;
              do {
                uVar34 = (ulong)((uint)uVar43 & 0x3f);
                lVar44 = 0x40 - (ulong)((int)pVVar36 + (uint)uVar43 & 0x3f);
                if ((VARR_lr_gap_t *)(0x40 - uVar34) <= pVVar36) {
                  lVar44 = 0;
                }
                psVar15 = &pVVar26->els_num + (uVar43 >> 6);
                *psVar15 = *psVar15 & ~((0xffffffffffffffffU >> (lVar44 + uVar34 & 0x3f)) << uVar34)
                ;
                lVar44 = 0x40 - (lVar44 + uVar34);
                uVar43 = uVar43 + lVar44;
                pVVar36 = (VARR_lr_gap_t *)((long)pVVar36 - lVar44);
              } while (pVVar36 != (VARR_lr_gap_t *)0x0);
            }
          }
        }
        else {
          uVar43 = (ulong)uVar23;
          local_c0 = in_R9;
          local_98._24_8_ = prVar49;
          if ((uVar43 < *(ulong *)prVar31 << 6) &&
             (((&prVar31->sorted_regs->els_num)[uVar23 >> 6] >> (uVar43 & 0x3f) & 1) != 0)) {
            puVar32 = *(ulong **)&((ra_ctx *)gen_ctx)->out_reloads[0].hreg;
            if ((puVar32 == (ulong *)0x0) || ((puVar32[2] == 0 || (*puVar32 <= uVar43))))
            goto LAB_00152fc2;
            local_98._0_8_ = *(undefined8 *)(puVar32[2] + uVar43 * 0x10);
            local_98._8_8_ = (MIR_op_t *)0x0;
            if (0x22 < uVar42) {
              lVar44 = *(long *)&((ra_ctx *)gen_ctx)->out_reloads[1].var;
              prVar48 = prVar45;
              local_98._48_8_ = prVar45;
              if (lVar44 == 0) goto LAB_00153018;
              if (0x22 < (uint)local_98._32_4_) {
                unaff_R13 = *(ra_ctx **)(lVar44 + 0x10);
                uVar23 = 0x23;
                do {
                  prStack_100 = (ra_ctx *)0x151d81;
                  iVar24 = may_mem_alias_p((MIR_op_t *)
                                           unaff_R13->lr_gap_bitmaps[(long)prVar45 * 2 + -7],
                                           (MIR_op_t *)
                                           unaff_R13->lr_gap_bitmaps[(ulong)uVar23 * 2 + -7]);
                  if ((iVar24 != 0) && ((ulong)uVar23 < *(ulong *)prVar31 << 6)) {
                    bVar19 = (byte)uVar23 & 0x3f;
                    psVar15 = &prVar31->sorted_regs->els_num + (uVar23 >> 6);
                    *psVar15 = *psVar15 & (-2L << bVar19 | 0xfffffffffffffffeU >> 0x40 - bVar19);
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar23 <= (uint)local_98._32_4_);
              }
              local_98._8_8_ = &local_c8->busy_used_locs;
              prVar45 = (ra_ctx *)local_98._48_8_;
            }
            uVar43 = (ulong)prVar45->lr_gap_bitmaps >> 6;
            unaff_R15 = (ra_ctx *)(uVar43 - *(ulong *)prVar31);
            if (*(ulong *)prVar31 <= uVar43 && unaff_R15 != (ra_ctx *)0x0) {
              do {
                if (prVar31->sorted_regs == (VARR_allocno_info_t *)0x0) goto LAB_00152f3f;
                pVVar25 = (VARR_expr_t *)(*(ulong *)prVar31 + 1);
                if ((VARR_expr_t *)prVar31->reg_renumber < pVVar25) {
                  unaff_R13 = (ra_ctx *)((long)&pVVar25->els_num + ((ulong)pVVar25 >> 1));
                  prStack_100 = (ra_ctx *)0x151e11;
                  pVVar26 = (VARR_allocno_info_t *)realloc(prVar31->sorted_regs,(long)unaff_R13 * 8)
                  ;
                  prVar31->sorted_regs = pVVar26;
                  prVar31->reg_renumber = (VARR_MIR_reg_t *)unaff_R13;
                }
                uVar43 = *(ulong *)prVar31;
                *(ulong *)prVar31 = uVar43 + 1;
                (&prVar31->sorted_regs->els_num)[uVar43] = 0;
                unaff_R15 = (ra_ctx *)((long)&unaff_R15[-1].out_reloads[7].hreg + 3);
              } while (unaff_R15 != (ra_ctx *)0x0);
            }
            psVar15 = &prVar31->sorted_regs->els_num + ((ulong)prVar45 >> 6 & 0x3ffffff);
            *psVar15 = *psVar15 | 1L << ((ulong)prVar45 & 0x3f);
            local_98._0_4_ = uVar42;
            prStack_100 = (ra_ctx *)0x151e62;
            set_spot2attr(gen_ctx,(spot_attr_t *)local_98);
          }
        }
      }
      else {
        local_c0 = in_R9;
        local_98._24_8_ = prVar49;
        if ((uVar23 == 0xa6) || (uVar23 == 0xaa)) goto LAB_00152540;
      }
LAB_0015218e:
      prVar48 = local_c8;
      if (*(int *)(VARR_bitmap_t **)local_a8._8_8_ != 0xa5) {
        prStack_100 = (ra_ctx *)0x1522f5;
        prVar46 = local_c8;
        target_bb_insn_translate(gen_ctx,(MIR_insn_t)local_c8,(void **)0x0);
        prVar49 = (ra_ctx *)local_98._24_8_;
        ctx_00 = local_b8;
        in_R9 = local_c0;
        goto LAB_001523e6;
      }
      puVar8 = *(undefined8 **)&((ra_ctx *)gen_ctx)->out_reloads[1].var;
      if ((puVar8 != (undefined8 *)0x0) && (puVar8[2] != 0)) {
        *puVar8 = 0;
        prVar46 = (ra_ctx *)0x0;
        unaff_R13 = local_c0;
        do {
          uVar34 = (ulong)prVar46 >> 6;
          uVar43 = *(ulong *)prVar31;
          bVar18 = true;
          prVar48 = prVar46;
          if (uVar34 < uVar43) {
            prVar48 = (ra_ctx *)(uVar43 << 6);
LAB_001521e6:
            uVar52 = (&prVar31->sorted_regs->els_num)[uVar34];
            if ((uVar52 == 0) || (uVar52 = uVar52 >> ((ulong)prVar46 & 0x3f), uVar52 == 0))
            goto LAB_001521f9;
            uVar43 = uVar52 & 1;
            unaff_R13 = prVar46;
            while (uVar43 == 0) {
              unaff_R13 = (ra_ctx *)((long)&unaff_R13->start_mem_loc + 1);
              uVar43 = uVar52 & 2;
              uVar52 = uVar52 >> 1;
            }
            prVar48 = (ra_ctx *)((long)&unaff_R13->start_mem_loc + 1);
            bVar18 = false;
          }
LAB_0015222d:
          if (bVar18) goto LAB_00152304;
          puVar8 = *(undefined8 **)&((ra_ctx *)gen_ctx)->out_reloads[0].hreg;
          if (((puVar8 == (undefined8 *)0x0) || (lVar44 = puVar8[2], lVar44 == 0)) ||
             ((ra_ctx *)*puVar8 <= unaff_R13)) goto LAB_00152ef3;
          plVar9 = *(long **)&((ra_ctx *)gen_ctx)->out_reloads[1].var;
          if ((void *)plVar9[2] == (void *)0x0) goto LAB_00152efd;
          prVar46 = *(ra_ctx **)(lVar44 + (long)unaff_R13 * 0x10);
          uVar10 = *(undefined8 *)(lVar44 + (long)unaff_R13 * 0x10 + 8);
          uVar43 = *plVar9 + 1;
          if ((ulong)plVar9[1] < uVar43) {
            lVar44 = (uVar43 >> 1) + uVar43;
            prStack_100 = (ra_ctx *)0x1522ab;
            local_c0 = prVar46;
            pvVar29 = realloc((void *)plVar9[2],lVar44 * 0x10);
            plVar9[2] = (long)pvVar29;
            plVar9[1] = lVar44;
            prVar46 = local_c0;
            gen_ctx = (gen_ctx_t)local_b0;
          }
          lVar44 = *plVar9;
          lVar38 = plVar9[2];
          *plVar9 = lVar44 + 1;
          *(ra_ctx **)(lVar38 + lVar44 * 0x10) = prVar46;
          *(undefined8 *)(lVar38 + lVar44 * 0x10 + 8) = uVar10;
          prVar46 = prVar48;
        } while( true );
      }
      goto LAB_00152f53;
    }
    if (uVar23 - 0xb7 < 2) {
      if (1 < (ushort)(*(byte *)(prVar48->lr_gap_bitmaps + 9) - 3)) goto LAB_00152f9e;
      if (*(char *)(prVar48->lr_gap_bitmaps + 3) == '\v') {
        iVar24 = *(int *)((long)prVar48->lr_gap_bitmaps + 0x2c);
        uVar23 = iVar24 + 0x23;
        if (iVar24 == 0) {
          uVar23 = 0;
        }
      }
      else {
        uVar23 = 0;
        if (*(char *)(prVar48->lr_gap_bitmaps + 3) == '\x02') {
          uVar23 = *(int *)&((DLIST_MIR_item_t *)(prVar48->lr_gap_bitmaps + 4))->head + 1;
        }
      }
      uVar43 = (ulong)uVar23;
      if ((uVar43 < *(ulong *)prVar31 << 6) &&
         (((&prVar31->sorted_regs->els_num)[uVar23 >> 6] >> (uVar43 & 0x3f) & 1) != 0)) {
        puVar32 = *(ulong **)&((ra_ctx *)gen_ctx)->out_reloads[0].hreg;
        if (((puVar32 == (ulong *)0x0) || (puVar32[2] == 0)) || (*puVar32 <= uVar43)) {
          prStack_100 = (ra_ctx *)0x152fc2;
          bb_version_generator_cold_6();
LAB_00152fc2:
          prStack_100 = (ra_ctx *)0x152fc7;
          bb_version_generator_cold_4();
          goto LAB_00152fc7;
        }
        puVar8 = (undefined8 *)(puVar32[2] + uVar43 * 0x10);
        local_98._0_8_ = *puVar8;
        local_98._8_8_ = puVar8[1];
        pMVar28 = (MIR_func_t)((ulong)local_98._0_8_ >> 0x20);
      }
      else {
        pMVar28 = (MIR_func_t)0x0;
      }
      iVar24 = (int)*(VARR_bitmap_t **)local_a8._8_8_;
      if (iVar24 == 0xb8) {
        if ((MIR_func_t)prVar48->lr_gap_bitmaps[10] == pMVar28) goto LAB_00152034;
      }
      else if ((iVar24 == 0xb7) && ((MIR_func_t)prVar48->lr_gap_bitmaps[10] != pMVar28)) {
LAB_00152034:
        if (((FILE *)((ra_ctx *)gen_ctx)->used_locs != (FILE *)0x0) &&
           (1 < *(int *)&((ra_ctx *)gen_ctx)->busy_used_locs)) {
          prStack_100 = (ra_ctx *)0x15205d;
          fwrite("  Remove property insn ",0x17,1,(FILE *)((ra_ctx *)gen_ctx)->used_locs);
          prStack_100 = (ra_ctx *)0x15207c;
          MIR_output_insn((MIR_context_t)local_b8,(FILE *)((ra_ctx *)gen_ctx)->used_locs,
                          (MIR_insn_t_conflict)prVar48,
                          (MIR_func_t)((ra_ctx *)gen_ctx)->sorted_regs[2].varr,1);
        }
        ctx_00 = local_b8;
        prVar46 = (ra_ctx *)((ra_ctx *)gen_ctx)->sorted_regs;
        prStack_100 = (ra_ctx *)0x152092;
        MIR_remove_insn((MIR_context_t)local_b8,(MIR_item_t_conflict)prVar46,
                        (MIR_insn_t_conflict)local_c8);
        prVar48 = local_c8;
        unaff_R15 = in_R9;
        goto LAB_001523e6;
      }
      pVStack_f8 = prVar48->busy_used_locs;
      pVStack_f0 = (VARR_MIR_proto_t *)prVar48->var_bbs;
      local_e8 = prVar48->spill_gaps;
      pVStack_e0 = prVar48->curr_gaps;
      pVStack_d8 = prVar48->lr_gap_bitmaps[0];
      pHStack_d0 = (HTAB_MIR_item_t *)prVar48->lr_gap_bitmaps[1];
      prStack_100 = (ra_ctx *)0x1520d2;
      prVar49 = (ra_ctx *)MIR_new_insn((MIR_context_t)ctx_00,MIR_JMP);
      prStack_100 = (ra_ctx *)0x1520e7;
      MIR_insert_insn_before
                ((MIR_context_t)ctx_00,(MIR_item_t_conflict)((ra_ctx *)gen_ctx)->sorted_regs,
                 (MIR_insn_t_conflict)prVar48,(MIR_insn_t_conflict)prVar49);
      if (((FILE *)((ra_ctx *)gen_ctx)->used_locs != (FILE *)0x0) &&
         (1 < *(int *)&((ra_ctx *)gen_ctx)->busy_used_locs)) {
        prStack_100 = (ra_ctx *)0x15210d;
        fwrite("  Change ",9,1,(FILE *)((ra_ctx *)gen_ctx)->used_locs);
        prStack_100 = (ra_ctx *)0x152127;
        MIR_output_insn((MIR_context_t)ctx_00,(FILE *)((ra_ctx *)gen_ctx)->used_locs,
                        (MIR_insn_t_conflict)prVar48,
                        (MIR_func_t)((ra_ctx *)gen_ctx)->sorted_regs[2].varr,0);
        prStack_100 = (ra_ctx *)0x152141;
        fwrite(" to ",4,1,(FILE *)((ra_ctx *)gen_ctx)->used_locs);
        prStack_100 = (ra_ctx *)0x15215e;
        MIR_output_insn((MIR_context_t)ctx_00,(FILE *)((ra_ctx *)gen_ctx)->used_locs,
                        (MIR_insn_t_conflict)prVar49,
                        (MIR_func_t)((ra_ctx *)gen_ctx)->sorted_regs[2].varr,1);
      }
      prVar46 = (ra_ctx *)((ra_ctx *)gen_ctx)->sorted_regs;
      prStack_100 = (ra_ctx *)0x15216d;
      MIR_remove_insn((MIR_context_t)ctx_00,(MIR_item_t_conflict)prVar46,
                      (MIR_insn_t_conflict)prVar48);
      unaff_R13 = in_R9;
      unaff_R15 = prVar48;
      goto LAB_001523f5;
    }
    if (uVar23 == 0xb9) goto LAB_001523e6;
    local_c0 = in_R9;
    local_98._24_8_ = prVar49;
    if (uVar23 != 0xb6) goto LAB_0015218e;
    if (1 < (ushort)(*(byte *)(prVar48->lr_gap_bitmaps + 3) - 3)) goto LAB_00152fea;
    if (*(char *)&prVar48->var_bbs == '\v') {
      iVar24 = *(int *)((long)&prVar48->curr_gaps + 4);
      uVar23 = iVar24 + 0x23;
      if (iVar24 == 0) {
        uVar23 = 0;
      }
    }
    else {
      uVar23 = 0;
      if (*(char *)&prVar48->var_bbs == '\x02') {
        uVar23 = *(int *)&prVar48->spill_gaps + 1;
      }
    }
    ctx_00 = local_b8;
    if (uVar23 != 0) {
      unaff_R15 = (ra_ctx *)(ulong)uVar23;
      uVar43 = *(ulong *)prVar31;
      if (((DLIST_MIR_item_t *)(prVar48->lr_gap_bitmaps + 4))->head == (MIR_item_t_conflict)0x0) {
        if (unaff_R15 < (ra_ctx *)(uVar43 << 6)) {
          bVar19 = (byte)uVar23 & 0x3f;
          prVar46 = (ra_ctx *)(-2L << bVar19 | 0xfffffffffffffffeU >> 0x40 - bVar19);
          psVar15 = &prVar31->sorted_regs->els_num + (uVar23 >> 6);
          *psVar15 = *psVar15 & (ulong)prVar46;
        }
      }
      else {
        uVar34 = (ulong)unaff_R15->lr_gap_bitmaps >> 6;
        lVar44 = uVar34 - uVar43;
        if (uVar43 <= uVar34 && lVar44 != 0) {
          do {
            if (prVar31->sorted_regs == (VARR_allocno_info_t *)0x0) goto LAB_00152f49;
            pVVar25 = (VARR_expr_t *)(*(ulong *)prVar31 + 1);
            if ((VARR_expr_t *)prVar31->reg_renumber < pVVar25) {
              unaff_R13 = (ra_ctx *)((long)&pVVar25->els_num + ((ulong)pVVar25 >> 1));
              prStack_100 = (ra_ctx *)0x152491;
              pVVar26 = (VARR_allocno_info_t *)realloc(prVar31->sorted_regs,(long)unaff_R13 * 8);
              prVar31->sorted_regs = pVVar26;
              prVar31->reg_renumber = (VARR_MIR_reg_t *)unaff_R13;
            }
            uVar43 = *(ulong *)prVar31;
            *(ulong *)prVar31 = uVar43 + 1;
            (&prVar31->sorted_regs->els_num)[uVar43] = 0;
            lVar44 = lVar44 + -1;
          } while (lVar44 != 0);
        }
        prVar48 = local_c8;
        psVar15 = &prVar31->sorted_regs->els_num + (uVar23 >> 6);
        *psVar15 = *psVar15 | 1L << ((ulong)unaff_R15 & 0x3f);
        local_98._4_4_ = *(undefined4 *)&((DLIST_MIR_item_t *)(local_c8->lr_gap_bitmaps + 4))->head;
        local_98._0_4_ = uVar23;
        local_98._8_8_ = (MIR_op_t *)0x0;
        if (0x22 < uVar23) {
          local_98._8_8_ = &local_c8->busy_used_locs;
        }
        prVar46 = (ra_ctx *)local_98;
        prStack_100 = (ra_ctx *)0x152507;
        set_spot2attr(gen_ctx,(spot_attr_t *)prVar46);
        prVar49 = (ra_ctx *)local_98._24_8_;
        ctx_00 = local_b8;
        in_R9 = local_c0;
      }
    }
    goto LAB_001523e6;
  }
  goto LAB_00152f8a;
LAB_001521f9:
  uVar34 = uVar34 + 1;
  prVar46 = (ra_ctx *)(uVar34 * 0x40);
  if (uVar43 == uVar34) goto LAB_0015222d;
  goto LAB_001521e6;
LAB_00152304:
  puVar8 = *(undefined8 **)&((ra_ctx *)gen_ctx)->in_reloads[7].var;
  if ((puVar8 == (undefined8 *)0x0) || (puVar8[2] == 0)) goto LAB_00152f58;
  *puVar8 = 0;
  puVar11 = *(uint32_t **)&((ra_ctx *)gen_ctx)->out_reloads[1].var;
  if (puVar11 == (uint32_t *)0x0) goto LAB_00152f5d;
  prStack_100 = (ra_ctx *)0x15235b;
  get_bb_version(gen_ctx,(bb_stub_t)((DLIST_MIR_item_t *)(local_c8->lr_gap_bitmaps + 4))->head->data
                 ,*puVar11,*(spot_attr_t **)(puVar11 + 4),0,(void **)local_a8);
  unaff_R15 = (ra_ctx *)local_a8._0_8_;
  plVar9 = *(long **)&((ra_ctx *)gen_ctx)->in_reloads[7].var;
  if ((void *)plVar9[2] == (void *)0x0) goto LAB_00152f62;
  uVar43 = *plVar9 + 1;
  if ((ulong)plVar9[1] < uVar43) {
    lVar44 = (uVar43 >> 1) + uVar43;
    prStack_100 = (ra_ctx *)0x152396;
    pvVar29 = realloc((void *)plVar9[2],lVar44 * 8);
    plVar9[2] = (long)pvVar29;
    plVar9[1] = lVar44;
    gen_ctx = (gen_ctx_t)local_b0;
  }
  prVar48 = local_c8;
  lVar44 = *plVar9;
  *plVar9 = lVar44 + 1;
  *(ra_ctx **)(plVar9[2] + lVar44 * 8) = unaff_R15;
  lVar44 = *(long *)&((ra_ctx *)gen_ctx)->in_reloads[7].var;
  if (lVar44 == 0) goto LAB_00152f67;
  prStack_100 = (ra_ctx *)0x1523d9;
  prVar46 = local_c8;
  target_bb_insn_translate(gen_ctx,(MIR_insn_t)local_c8,*(void ***)(lVar44 + 0x10));
  prVar49 = (ra_ctx *)local_98._24_8_;
  ctx_00 = local_b8;
  in_R9 = unaff_R13;
LAB_001523e6:
  if (prVar48 == *(ra_ctx **)(local_98._16_8_ + 0x20)) goto LAB_00152540;
LAB_001523f5:
  prVar48 = prVar49;
  local_a8._8_8_ = &prVar48->used_locs;
  pVVar27 = prVar48->used_locs;
  if (0xffffffd0 < (int)pVVar27 - 0xa5U) goto LAB_00152540;
  goto LAB_00151b82;
LAB_001525c3:
  uVar34 = uVar34 + 1;
  prVar46 = (ra_ctx *)(uVar34 * 0x40);
  if (uVar43 == uVar34) goto LAB_001525f7;
  goto LAB_001525b0;
LAB_00152738:
  prVar46 = (ra_ctx *)((ra_ctx *)gen_ctx)->used_locs;
  if ((prVar46 != (ra_ctx *)0x0) && (1 < *(int *)&((ra_ctx *)gen_ctx)->busy_used_locs)) {
    ctx_00 = (ra_ctx *)0xa;
    prStack_100 = (ra_ctx *)0x152752;
    fputc(10,(FILE *)prVar46);
  }
  puVar8 = *(undefined8 **)&((ra_ctx *)gen_ctx)->in_reloads[7].var;
  if ((puVar8 == (undefined8 *)0x0) || (puVar8[2] == 0)) goto LAB_00152f94;
  *puVar8 = 0;
  iVar24 = (int)*(VARR_bitmap_t **)local_a8._8_8_;
  if (iVar24 - 0x76U < 0x2f) {
    puVar11 = *(uint32_t **)&((ra_ctx *)gen_ctx)->out_reloads[1].var;
    if (puVar11 == (uint32_t *)0x0) goto LAB_00152fdb;
    prStack_100 = (ra_ctx *)0x1527b5;
    get_bb_version(gen_ctx,(bb_stub_t)prVar45->spill_gaps->els_num,*puVar11,
                   *(spot_attr_t **)(puVar11 + 4),0,(void **)local_a8);
    unaff_R15 = (ra_ctx *)local_a8._0_8_;
    plVar9 = *(long **)&((ra_ctx *)gen_ctx)->in_reloads[7].var;
    if ((void *)plVar9[2] == (void *)0x0) goto LAB_00152fe0;
    uVar43 = *plVar9 + 1;
    if ((ulong)plVar9[1] < uVar43) {
      lVar44 = (uVar43 >> 1) + uVar43;
      prStack_100 = (ra_ctx *)0x1527f0;
      pvVar29 = realloc((void *)plVar9[2],lVar44 * 8);
      plVar9[2] = (long)pvVar29;
      plVar9[1] = lVar44;
      gen_ctx = (gen_ctx_t)local_b0;
    }
    lVar44 = *plVar9;
    *plVar9 = lVar44 + 1;
    *(ra_ctx **)(plVar9[2] + lVar44 * 8) = unaff_R15;
    lVar44._0_4_ = ((ra_ctx *)gen_ctx)->in_reloads[7].var;
    lVar44._4_4_ = ((ra_ctx *)gen_ctx)->in_reloads[7].hreg;
    if (lVar44 == 0) goto LAB_00152fe5;
LAB_0015281f:
    jump_addrs = *(void ***)(lVar44 + 0x10);
    prVar45 = local_c8;
LAB_00152828:
    prStack_100 = (ra_ctx *)0x152833;
    prVar46 = prVar45;
    ctx_00 = (ra_ctx *)gen_ctx;
    target_bb_insn_translate(gen_ctx,(MIR_insn_t)prVar45,jump_addrs);
    prVar48 = prVar49;
  }
  else {
    if (iVar24 == 0xa6) {
      jump_addrs = (void **)0x0;
      goto LAB_00152828;
    }
    prVar48 = prVar49;
    if (iVar24 == 0xaa) {
      if ((ulong)*(VARR_bitmap_t **)local_a8._8_8_ >> 0x21 != 0) {
        prVar45 = (ra_ctx *)(local_c8->lr_gap_bitmaps + 4);
        prVar31 = (ra_ctx *)&DAT_00000001;
        unaff_R15 = (ra_ctx *)local_a8;
        do {
          puVar11 = *(uint32_t **)&((ra_ctx *)gen_ctx)->out_reloads[1].var;
          if (puVar11 == (uint32_t *)0x0) goto LAB_0015300e;
          prVar46 = (ra_ctx *)(*(gen_ctx **)&prVar45->start_mem_loc)->ctx;
          prStack_100 = (ra_ctx *)0x152e4e;
          get_bb_version(gen_ctx,(bb_stub_t)prVar46,*puVar11,*(spot_attr_t **)(puVar11 + 4),0,
                         (void **)unaff_R15);
          prVar49 = (ra_ctx *)local_a8._0_8_;
          unaff_R13 = *(ra_ctx **)&((ra_ctx *)gen_ctx)->in_reloads[7].var;
          ctx_00 = (ra_ctx *)unaff_R13->sorted_regs;
          if (ctx_00 == (ra_ctx *)0x0) goto LAB_00153013;
          p_Var54 = (_IO_FILE *)((long)&(*(gen_ctx **)&unaff_R13->start_mem_loc)->ctx + 1);
          if ((_IO_FILE *)unaff_R13->reg_renumber < p_Var54) {
            p_Var54 = (_IO_FILE *)((long)&p_Var54->_flags + ((ulong)p_Var54 >> 1));
            prVar46 = (ra_ctx *)((long)p_Var54 * 8);
            prStack_100 = (ra_ctx *)0x152e8a;
            pVVar26 = (VARR_allocno_info_t *)realloc(ctx_00,(size_t)prVar46);
            unaff_R13->sorted_regs = pVVar26;
            unaff_R13->reg_renumber = (VARR_MIR_reg_t *)p_Var54;
            gen_ctx = (gen_ctx_t)local_b0;
          }
          pgVar50 = *(gen_ctx **)&unaff_R13->start_mem_loc;
          *(gen_ctx **)&unaff_R13->start_mem_loc = (gen_ctx *)((long)&pgVar50->ctx + 1);
          (&unaff_R13->sorted_regs->els_num)[(long)pgVar50] = (size_t)prVar49;
          prVar31 = (ra_ctx *)((long)&prVar31->start_mem_loc + 1);
          prVar45 = (ra_ctx *)&prVar45->spill_gaps;
          prVar48 = prVar49;
        } while (prVar31 < (ra_ctx *)(ulong)*(uint *)((long)(VARR_bitmap_t **)local_a8._8_8_ + 4));
      }
      lVar44._0_4_ = ((ra_ctx *)gen_ctx)->in_reloads[7].var;
      lVar44._4_4_ = ((ra_ctx *)gen_ctx)->in_reloads[7].hreg;
      if (lVar44 == 0) {
        prStack_100 = (ra_ctx *)0x152ed8;
        bb_version_generator_cold_16();
        prVar48 = local_c8;
        in_R9 = local_c0;
        goto LAB_00152540;
      }
      goto LAB_0015281f;
    }
  }
  uVar23 = *(int *)(VARR_bitmap_t **)local_a8._8_8_ - 0x76;
  if ((uVar23 < 0x37) && ((0x71000000000001U >> ((ulong)uVar23 & 0x3f) & 1) != 0))
  goto LAB_0015297f;
  puVar8 = *(undefined8 **)&((ra_ctx *)gen_ctx)->in_reloads[7].var;
  if ((puVar8 != (undefined8 *)0x0) && (puVar8[2] != 0)) {
    *puVar8 = 0;
    puVar11 = *(uint32_t **)&((ra_ctx *)gen_ctx)->out_reloads[1].var;
    if (puVar11 == (uint32_t *)0x0) goto LAB_0015301d;
    prVar46 = (ra_ctx *)(local_98._16_8_ + 0x28);
    prStack_100 = (ra_ctx *)0x1528a7;
    get_bb_version(gen_ctx,(bb_stub_t)prVar46,*puVar11,*(spot_attr_t **)(puVar11 + 4),0,
                   (void **)local_a8);
    prVar49 = (ra_ctx *)local_a8._0_8_;
    prVar45 = *(ra_ctx **)&((ra_ctx *)gen_ctx)->in_reloads[7].var;
    ctx_00 = (ra_ctx *)prVar45->sorted_regs;
    if (ctx_00 == (ra_ctx *)0x0) goto LAB_00153022;
    p_Var54 = (_IO_FILE *)((long)&(*(gen_ctx **)&prVar45->start_mem_loc)->ctx + 1);
    if ((_IO_FILE *)prVar45->reg_renumber < p_Var54) {
      p_Var54 = (_IO_FILE *)((long)&p_Var54->_flags + ((ulong)p_Var54 >> 1));
      prVar46 = (ra_ctx *)((long)p_Var54 * 8);
      prStack_100 = (ra_ctx *)0x1528e2;
      pVVar26 = (VARR_allocno_info_t *)realloc(ctx_00,(size_t)prVar46);
      prVar45->sorted_regs = pVVar26;
      prVar45->reg_renumber = (VARR_MIR_reg_t *)p_Var54;
      gen_ctx = (gen_ctx_t)local_b0;
    }
    pgVar50 = *(gen_ctx **)&prVar45->start_mem_loc;
    *(gen_ctx **)&prVar45->start_mem_loc = (gen_ctx *)((long)&pgVar50->ctx + 1);
    (&prVar45->sorted_regs->els_num)[(long)pgVar50] = (size_t)prVar49;
    lVar44 = *(long *)&((ra_ctx *)gen_ctx)->in_reloads[7].var;
    if (lVar44 == 0) goto LAB_00153027;
    prStack_100 = (ra_ctx *)0x15293c;
    out_insn(gen_ctx,(MIR_insn_t)((ra_ctx *)gen_ctx)->lr_gap_bitmaps[0x1f]->size,
             patterns[*(int *)&((ra_ctx *)gen_ctx)->lr_gap_bitmaps[0x1f]->varr].replacement,
             *(void ***)(lVar44 + 0x10));
    goto LAB_0015297f;
  }
  prStack_100 = (ra_ctx *)0x15300e;
  bb_version_generator_cold_41();
LAB_0015300e:
  prStack_100 = (ra_ctx *)0x153013;
  bb_version_generator_cold_18();
LAB_00153013:
  prStack_100 = (ra_ctx *)0x153018;
  bb_version_generator_cold_17();
LAB_00153018:
  prStack_100 = (ra_ctx *)0x15301d;
  bb_version_generator_cold_2();
LAB_0015301d:
  prStack_100 = (ra_ctx *)0x153022;
  bb_version_generator_cold_40();
LAB_00153022:
  prVar49 = unaff_R15;
  prStack_100 = (ra_ctx *)0x153027;
  bb_version_generator_cold_39();
LAB_00153027:
  prStack_100 = (ra_ctx *)MIR_gen_finish;
  bb_version_generator_cold_38();
  pgVar50 = *(gen_ctx **)&ctx_00->start_mem_loc;
  ctx_01 = ctx_00;
  prStack_120 = prVar45;
  prStack_118 = prVar31;
  prStack_110 = unaff_R13;
  prStack_108 = (ra_ctx *)gen_ctx;
  prStack_100 = prVar49;
  if (pgVar50 != (gen_ctx *)0x0) {
    prVar31 = (ra_ctx *)pgVar50->data_flow_ctx;
    prVar49 = *(ra_ctx **)prVar31;
    if ((prVar49 == (ra_ctx *)0x0) ||
       (ctx_01 = (ra_ctx *)prVar49->sorted_regs, prVar45 = ctx_00, ctx_01 == (ra_ctx *)0x0)) {
LAB_001544e5:
      prStack_128 = (ra_ctx *)0x1544ea;
      MIR_gen_finish_cold_95();
      prVar51 = ctx_01;
      ctx_01 = prVar49;
LAB_001544ea:
      __ptr_01 = prVar51;
      prStack_128 = (ra_ctx *)0x1544ef;
      MIR_gen_finish_cold_94();
LAB_001544ef:
      prStack_128 = (ra_ctx *)0x1544f4;
      MIR_gen_finish_cold_93();
LAB_001544f4:
      prVar49 = __ptr_01;
      prStack_128 = (ra_ctx *)0x1544f9;
      MIR_gen_finish_cold_92();
LAB_001544f9:
      prStack_128 = (ra_ctx *)0x1544fe;
      MIR_gen_finish_cold_91();
LAB_001544fe:
      prVar51 = prVar49;
      prStack_128 = (ra_ctx *)0x154503;
      MIR_gen_finish_cold_90();
LAB_00154503:
      prStack_128 = (ra_ctx *)0x154508;
      MIR_gen_finish_cold_89();
LAB_00154508:
      prVar49 = prVar51;
      prStack_128 = (ra_ctx *)0x15450d;
      MIR_gen_finish_cold_88();
LAB_0015450d:
      prStack_128 = (ra_ctx *)0x154512;
      MIR_gen_finish_cold_87();
LAB_00154512:
      prStack_128 = (ra_ctx *)0x154517;
      MIR_gen_finish_cold_86();
LAB_00154517:
      prVar51 = prVar49;
      prStack_128 = (ra_ctx *)0x15451c;
      MIR_gen_finish_cold_85();
LAB_0015451c:
      prStack_128 = (ra_ctx *)0x154521;
      MIR_gen_finish_cold_84();
LAB_00154521:
      prStack_128 = (ra_ctx *)0x154526;
      MIR_gen_finish_cold_83();
LAB_00154526:
      prVar49 = prVar51;
      prStack_128 = (ra_ctx *)0x15452b;
      MIR_gen_finish_cold_82();
LAB_0015452b:
      prStack_128 = (ra_ctx *)0x154530;
      MIR_gen_finish_cold_81();
LAB_00154530:
      prStack_128 = (ra_ctx *)0x154535;
      MIR_gen_finish_cold_80();
LAB_00154535:
      prVar51 = prVar49;
      prStack_128 = (ra_ctx *)0x15453a;
      MIR_gen_finish_cold_79();
LAB_0015453a:
      prStack_128 = (ra_ctx *)0x15453f;
      MIR_gen_finish_cold_78();
LAB_0015453f:
      prStack_128 = (ra_ctx *)0x154544;
      MIR_gen_finish_cold_77();
LAB_00154544:
      prStack_128 = (ra_ctx *)0x154549;
      MIR_gen_finish_cold_76();
LAB_00154549:
      prVar49 = prVar51;
      prStack_128 = (ra_ctx *)0x15454e;
      MIR_gen_finish_cold_75();
LAB_0015454e:
      prStack_128 = (ra_ctx *)0x154553;
      MIR_gen_finish_cold_74();
LAB_00154553:
      prVar51 = prVar49;
      prStack_128 = (ra_ctx *)0x154558;
      MIR_gen_finish_cold_73();
LAB_00154558:
      prStack_128 = (ra_ctx *)0x15455d;
      MIR_gen_finish_cold_72();
LAB_0015455d:
      prVar49 = prVar51;
      prStack_128 = (ra_ctx *)0x154562;
      MIR_gen_finish_cold_71();
LAB_00154562:
      prStack_128 = (ra_ctx *)0x154567;
      MIR_gen_finish_cold_70();
LAB_00154567:
      prVar51 = prVar49;
      prStack_128 = (ra_ctx *)0x15456c;
      MIR_gen_finish_cold_69();
LAB_0015456c:
      prStack_128 = (ra_ctx *)0x154571;
      MIR_gen_finish_cold_68();
LAB_00154571:
      prVar49 = prVar51;
      prStack_128 = (ra_ctx *)0x154576;
      MIR_gen_finish_cold_67();
LAB_00154576:
      prStack_128 = (ra_ctx *)0x15457b;
      MIR_gen_finish_cold_66();
LAB_0015457b:
      prVar51 = prVar49;
      prStack_128 = (ra_ctx *)0x154580;
      MIR_gen_finish_cold_65();
LAB_00154580:
      prStack_128 = (ra_ctx *)0x154585;
      MIR_gen_finish_cold_64();
LAB_00154585:
      prVar49 = prVar51;
      prStack_128 = (ra_ctx *)0x15458a;
      MIR_gen_finish_cold_63();
    }
    else {
      prStack_128 = (ra_ctx *)0x15306a;
      free(ctx_01);
      prStack_128 = (ra_ctx *)0x153072;
      free(prVar49);
      *(ulong *)prVar31 = 0;
      prVar31 = (ra_ctx *)pgVar50->data_flow_ctx;
      __ptr_01 = (ra_ctx *)prVar31->reg_renumber;
      prVar51 = prVar49;
      ctx_01 = __ptr_01;
      if ((__ptr_01 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)__ptr_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_001544ea;
      prStack_128 = (ra_ctx *)0x1530a1;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x1530a9;
      free(__ptr_01);
      prVar31->reg_renumber = (VARR_MIR_reg_t *)0x0;
      ctx_01 = (ra_ctx *)pgVar50->data_flow_ctx->bb_to_consider;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (__ptr_01 = (ra_ctx *)ctx_01->sorted_regs, __ptr_01 == (ra_ctx *)0x0)) goto LAB_001544ef;
      prStack_128 = (ra_ctx *)0x1530d8;
      free(__ptr_01);
      prStack_128 = (ra_ctx *)0x1530e0;
      free(ctx_01);
      __ptr_01 = (ra_ctx *)pgVar50->data_flow_ctx;
      prStack_128 = (ra_ctx *)0x1530ec;
      free(__ptr_01);
      pgVar50->data_flow_ctx = (data_flow_ctx *)0x0;
      prVar31 = (ra_ctx *)pgVar50->ssa_ctx;
      prVar49 = *(ra_ctx **)prVar31;
      ctx_01 = prVar49;
      if ((prVar49 == (ra_ctx *)0x0) ||
         (__ptr_01 = (ra_ctx *)prVar49->sorted_regs, __ptr_01 == (ra_ctx *)0x0)) goto LAB_001544f4;
      prStack_128 = (ra_ctx *)0x15311d;
      free(__ptr_01);
      prStack_128 = (ra_ctx *)0x153125;
      free(prVar49);
      *(ulong *)prVar31 = 0;
      prVar31 = (ra_ctx *)pgVar50->ssa_ctx;
      ctx_01 = (ra_ctx *)prVar31->reg_renumber;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_001544f9;
      prStack_128 = (ra_ctx *)0x153154;
      free(prVar49);
      prStack_128 = (ra_ctx *)0x15315c;
      free(ctx_01);
      prVar31->reg_renumber = (VARR_MIR_reg_t *)0x0;
      prVar31 = (ra_ctx *)pgVar50->ssa_ctx;
      prVar51 = (ra_ctx *)prVar31->sorted_regs;
      prVar49 = ctx_01;
      ctx_01 = prVar51;
      if ((prVar51 == (ra_ctx *)0x0) ||
         (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_001544fe;
      prStack_128 = (ra_ctx *)0x15318c;
      free(prVar49);
      prStack_128 = (ra_ctx *)0x153194;
      free(prVar51);
      prVar31->sorted_regs = (VARR_allocno_info_t *)0x0;
      prVar31 = (ra_ctx *)pgVar50->ssa_ctx;
      ctx_01 = (ra_ctx *)prVar31->used_locs;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154503;
      prStack_128 = (ra_ctx *)0x1531c4;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x1531cc;
      free(ctx_01);
      prVar31->used_locs = (VARR_bitmap_t *)0x0;
      prVar31 = (ra_ctx *)pgVar50->ssa_ctx;
      prVar51 = (ra_ctx *)prVar31->busy_used_locs;
      if (prVar51->var_bbs != (VARR_bitmap_t *)0x0) {
        prStack_128 = (ra_ctx *)0x1531ed;
        HTAB_def_tab_el_t_clear((HTAB_def_tab_el_t *)prVar51);
      }
      unaff_R13 = (ra_ctx *)prVar31->busy_used_locs;
      prVar49 = (ra_ctx *)unaff_R13->spill_gaps;
      ctx_01 = prVar49;
      if ((prVar49 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154508;
      prStack_128 = (ra_ctx *)0x153211;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x153219;
      free(prVar49);
      unaff_R13->spill_gaps = (VARR_lr_gap_t *)0x0;
      unaff_R13 = (ra_ctx *)prVar31->busy_used_locs;
      ctx_01 = (ra_ctx *)unaff_R13->curr_gaps;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_0015450d;
      prStack_128 = (ra_ctx *)0x153245;
      free(prVar49);
      prStack_128 = (ra_ctx *)0x15324d;
      free(ctx_01);
      unaff_R13->curr_gaps = (VARR_lr_gap_t *)0x0;
      prVar49 = (ra_ctx *)prVar31->busy_used_locs;
      prStack_128 = (ra_ctx *)0x15325e;
      free(prVar49);
      prVar31->busy_used_locs = (VARR_bitmap_t *)0x0;
      prVar31 = (ra_ctx *)pgVar50->ssa_ctx;
      ctx_01 = (ra_ctx *)prVar31->var_bbs;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_00154512;
      prStack_128 = (ra_ctx *)0x15328a;
      free(prVar49);
      prStack_128 = (ra_ctx *)0x153292;
      free(ctx_01);
      prVar31->var_bbs = (VARR_bitmap_t *)0x0;
      prVar31 = (ra_ctx *)pgVar50->ssa_ctx;
      prVar51 = (ra_ctx *)prVar31->spill_gaps;
      prVar49 = ctx_01;
      ctx_01 = prVar51;
      if ((prVar51 == (ra_ctx *)0x0) ||
         (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_00154517;
      prStack_128 = (ra_ctx *)0x1532c2;
      free(prVar49);
      prStack_128 = (ra_ctx *)0x1532ca;
      free(prVar51);
      prVar31->spill_gaps = (VARR_lr_gap_t *)0x0;
      prVar31 = (ra_ctx *)pgVar50->ssa_ctx;
      ctx_01 = (ra_ctx *)prVar31->curr_gaps;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_0015451c;
      prStack_128 = (ra_ctx *)0x1532fa;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x153302;
      free(ctx_01);
      prVar31->curr_gaps = (VARR_lr_gap_t *)0x0;
      prVar51 = (ra_ctx *)pgVar50->ssa_ctx;
      prStack_128 = (ra_ctx *)0x153316;
      free(prVar51);
      pgVar50->ssa_ctx = (ssa_ctx *)0x0;
      prVar31 = (ra_ctx *)pgVar50->gvn_ctx;
      ctx_01 = (ra_ctx *)prVar31->reg_renumber;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154521;
      prStack_128 = (ra_ctx *)0x153344;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x15334c;
      free(ctx_01);
      prVar31->reg_renumber = (VARR_MIR_reg_t *)0x0;
      prVar31 = (ra_ctx *)pgVar50->gvn_ctx;
      prVar51 = (ra_ctx *)prVar31->used_locs;
      if (prVar51->var_bbs != (VARR_bitmap_t *)0x0) {
        prStack_128 = (ra_ctx *)0x15336d;
        HTAB_expr_t_clear((HTAB_expr_t *)prVar51);
      }
      unaff_R13 = (ra_ctx *)prVar31->used_locs;
      prVar49 = (ra_ctx *)unaff_R13->spill_gaps;
      ctx_01 = prVar49;
      if ((prVar49 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154526;
      prStack_128 = (ra_ctx *)0x153391;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x153399;
      free(prVar49);
      unaff_R13->spill_gaps = (VARR_lr_gap_t *)0x0;
      unaff_R13 = (ra_ctx *)prVar31->used_locs;
      ctx_01 = (ra_ctx *)unaff_R13->curr_gaps;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_0015452b;
      prStack_128 = (ra_ctx *)0x1533c5;
      free(prVar49);
      prStack_128 = (ra_ctx *)0x1533cd;
      free(ctx_01);
      unaff_R13->curr_gaps = (VARR_lr_gap_t *)0x0;
      prStack_128 = (ra_ctx *)0x1533de;
      free((HTAB_expr_t *)prVar31->used_locs);
      prVar31->used_locs = (VARR_bitmap_t *)0x0;
      prVar49 = (ra_ctx *)pgVar50->gvn_ctx->temp_mem_insn;
      prStack_128 = (ra_ctx *)0x1533f2;
      free(prVar49);
      prVar31 = (ra_ctx *)pgVar50->gvn_ctx;
      ctx_01 = (ra_ctx *)prVar31->sorted_regs;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_00154530;
      prStack_128 = (ra_ctx *)0x153419;
      free(prVar49);
      prStack_128 = (ra_ctx *)0x153421;
      free(ctx_01);
      prVar31->sorted_regs = (VARR_allocno_info_t *)0x0;
      prVar31 = (ra_ctx *)pgVar50->gvn_ctx;
      prVar49 = (ra_ctx *)prVar31->busy_used_locs;
      if (prVar49->var_bbs != (VARR_bitmap_t *)0x0) {
        prStack_128 = (ra_ctx *)0x153442;
        HTAB_mem_expr_t_clear((HTAB_mem_expr_t *)prVar49);
      }
      unaff_R13 = (ra_ctx *)prVar31->busy_used_locs;
      prVar51 = (ra_ctx *)unaff_R13->spill_gaps;
      ctx_01 = prVar51;
      if ((prVar51 == (ra_ctx *)0x0) ||
         (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_00154535;
      prStack_128 = (ra_ctx *)0x153466;
      free(prVar49);
      prStack_128 = (ra_ctx *)0x15346e;
      free(prVar51);
      unaff_R13->spill_gaps = (VARR_lr_gap_t *)0x0;
      unaff_R13 = (ra_ctx *)prVar31->busy_used_locs;
      ctx_01 = (ra_ctx *)unaff_R13->curr_gaps;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_0015453a;
      prStack_128 = (ra_ctx *)0x15349a;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x1534a2;
      free(ctx_01);
      unaff_R13->curr_gaps = (VARR_lr_gap_t *)0x0;
      prVar51 = (ra_ctx *)prVar31->busy_used_locs;
      prStack_128 = (ra_ctx *)0x1534b3;
      free(prVar51);
      prVar31->busy_used_locs = (VARR_bitmap_t *)0x0;
      prVar31 = (ra_ctx *)pgVar50->gvn_ctx;
      ctx_01 = (ra_ctx *)prVar31->var_bbs;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_0015453f;
      prStack_128 = (ra_ctx *)0x1534df;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x1534e7;
      free(ctx_01);
      prVar31->var_bbs = (VARR_bitmap_t *)0x0;
      prVar51 = (ra_ctx *)pgVar50->gvn_ctx;
      prStack_128 = (ra_ctx *)0x1534fb;
      free(prVar51);
      pgVar50->gvn_ctx = (gvn_ctx *)0x0;
      prVar31 = (ra_ctx *)pgVar50->lr_ctx;
      ctx_01 = (ra_ctx *)prVar31->lr_gap_bitmaps[3];
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154544;
      prStack_128 = (ra_ctx *)0x153529;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x153531;
      free(ctx_01);
      prVar31->lr_gap_bitmaps[3] = (bitmap_t)0x0;
      prVar31 = (ra_ctx *)pgVar50->lr_ctx;
      prVar49 = (ra_ctx *)prVar31->lr_gap_bitmaps[4];
      prVar51 = ctx_01;
      ctx_01 = prVar49;
      if ((prVar49 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154549;
      prStack_128 = (ra_ctx *)0x153561;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x153569;
      free(prVar49);
      prVar31->lr_gap_bitmaps[4] = (bitmap_t)0x0;
      ctx_01 = (ra_ctx *)pgVar50->lr_ctx->live_vars;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_0015454e;
      prStack_128 = (ra_ctx *)0x153598;
      free(prVar49);
      prStack_128 = (ra_ctx *)0x1535a0;
      free(ctx_01);
      prVar51 = (ra_ctx *)pgVar50->lr_ctx->referenced_vars;
      prVar49 = ctx_01;
      ctx_01 = prVar51;
      if ((prVar51 == (ra_ctx *)0x0) ||
         (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_00154553;
      prStack_128 = (ra_ctx *)0x1535c6;
      free(prVar49);
      prStack_128 = (ra_ctx *)0x1535ce;
      free(prVar51);
      ctx_01 = (ra_ctx *)pgVar50->lr_ctx->points_with_born_vars;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154558;
      prStack_128 = (ra_ctx *)0x1535f4;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x1535fc;
      free(ctx_01);
      prVar49 = (ra_ctx *)pgVar50->lr_ctx->points_with_dead_vars;
      prVar51 = ctx_01;
      ctx_01 = prVar49;
      if ((prVar49 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_0015455d;
      prStack_128 = (ra_ctx *)0x153622;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x15362a;
      free(prVar49);
      ctx_01 = (ra_ctx *)pgVar50->lr_ctx->points_with_born_or_dead_vars;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_00154562;
      prStack_128 = (ra_ctx *)0x153650;
      free(prVar49);
      prStack_128 = (ra_ctx *)0x153658;
      free(ctx_01);
      plVar16 = pgVar50->lr_ctx;
      __ptr = plVar16->free_lr_list;
      while (__ptr != (live_range_t_conflict)0x0) {
        plVar16->free_lr_list = __ptr->next;
        prStack_128 = (ra_ctx *)0x153678;
        free(__ptr);
        plVar16 = pgVar50->lr_ctx;
        __ptr = plVar16->free_lr_list;
      }
      plVar16 = pgVar50->lr_ctx;
      __ptr_00 = plVar16->free_lr_bb_list;
      while (__ptr_00 != (lr_bb_t_conflict)0x0) {
        plVar16->free_lr_bb_list = __ptr_00->next;
        prStack_128 = (ra_ctx *)0x1536ac;
        free(__ptr_00);
        plVar16 = pgVar50->lr_ctx;
        __ptr_00 = plVar16->free_lr_bb_list;
      }
      prVar31 = (ra_ctx *)pgVar50->lr_ctx;
      prVar51 = (ra_ctx *)prVar31->reg_renumber;
      prVar49 = (ra_ctx *)0x0;
      ctx_01 = prVar51;
      if ((prVar51 == (ra_ctx *)0x0) ||
         (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_00154567;
      prStack_128 = (ra_ctx *)0x1536e7;
      free(prVar49);
      prStack_128 = (ra_ctx *)0x1536ef;
      free(prVar51);
      prVar31->reg_renumber = (VARR_MIR_reg_t *)0x0;
      prVar31 = (ra_ctx *)pgVar50->lr_ctx;
      ctx_01 = (ra_ctx *)prVar31->sorted_regs;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_0015456c;
      prStack_128 = (ra_ctx *)0x15371f;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x153727;
      free(ctx_01);
      prVar31->sorted_regs = (VARR_allocno_info_t *)0x0;
      prVar51 = (ra_ctx *)pgVar50->lr_ctx;
      prStack_128 = (ra_ctx *)0x15373b;
      free(prVar51);
      pgVar50->lr_ctx = (lr_ctx *)0x0;
      prVar31 = (ra_ctx *)pgVar50->coalesce_ctx;
      prVar49 = *(ra_ctx **)prVar31;
      ctx_01 = prVar49;
      if ((prVar49 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154571;
      prStack_128 = (ra_ctx *)0x153768;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x153770;
      free(prVar49);
      *(ulong *)prVar31 = 0;
      prVar31 = (ra_ctx *)pgVar50->coalesce_ctx;
      ctx_01 = (ra_ctx *)prVar31->reg_renumber;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_00154576;
      prStack_128 = (ra_ctx *)0x15379f;
      free(prVar49);
      prStack_128 = (ra_ctx *)0x1537a7;
      free(ctx_01);
      prVar31->reg_renumber = (VARR_MIR_reg_t *)0x0;
      prVar31 = (ra_ctx *)pgVar50->coalesce_ctx;
      prVar51 = (ra_ctx *)prVar31->sorted_regs;
      prVar49 = ctx_01;
      ctx_01 = prVar51;
      if ((prVar51 == (ra_ctx *)0x0) ||
         (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_0015457b;
      prStack_128 = (ra_ctx *)0x1537d7;
      free(prVar49);
      prStack_128 = (ra_ctx *)0x1537df;
      free(prVar51);
      prVar31->sorted_regs = (VARR_allocno_info_t *)0x0;
      ctx_01 = (ra_ctx *)pgVar50->coalesce_ctx->conflict_matrix;
      if ((ctx_01 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154580;
      prStack_128 = (ra_ctx *)0x15380e;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x153816;
      free(ctx_01);
      prVar51 = (ra_ctx *)pgVar50->coalesce_ctx;
      prStack_128 = (ra_ctx *)0x153822;
      free(prVar51);
      pgVar50->coalesce_ctx = (coalesce_ctx *)0x0;
      prVar31 = pgVar50->ra_ctx;
      prVar49 = (ra_ctx *)prVar31->reg_renumber;
      ctx_01 = prVar49;
      if ((prVar49 == (ra_ctx *)0x0) ||
         (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154585;
      prStack_128 = (ra_ctx *)0x153854;
      free(prVar51);
      prStack_128 = (ra_ctx *)0x15385c;
      free(prVar49);
      prVar31->reg_renumber = (VARR_MIR_reg_t *)0x0;
      prVar31 = pgVar50->ra_ctx;
      ctx_01 = (ra_ctx *)prVar31->sorted_regs;
      if ((ctx_01 != (ra_ctx *)0x0) &&
         (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 != (ra_ctx *)0x0)) {
        prStack_128 = (ra_ctx *)0x15388c;
        free(prVar49);
        prStack_128 = (ra_ctx *)0x153894;
        free(ctx_01);
        prVar31->sorted_regs = (VARR_allocno_info_t *)0x0;
        while( true ) {
          prVar31 = pgVar50->ra_ctx;
          prVar49 = (ra_ctx *)prVar31->used_locs;
          if (prVar49 == (ra_ctx *)0x0) break;
          pgVar17 = *(gen_ctx **)&prVar49->start_mem_loc;
          if (pgVar17 == (gen_ctx *)0x0) {
            ctx_01 = (ra_ctx *)prVar49->sorted_regs;
            if (ctx_01 == (ra_ctx *)0x0) goto LAB_0015466b;
            prStack_128 = (ra_ctx *)0x15390a;
            free(ctx_01);
            prStack_128 = (ra_ctx *)0x153912;
            free(prVar49);
            prVar31->used_locs = (VARR_bitmap_t *)0x0;
            ctx_01 = prVar49;
            goto LAB_0015391b;
          }
          if (prVar49->sorted_regs == (VARR_allocno_info_t *)0x0) goto LAB_001544cc;
          *(gen_ctx **)&prVar49->start_mem_loc = (gen_ctx *)((long)&pgVar17[-1].spot_attrs + 7);
          prVar49 = *(ra_ctx **)((long)prVar49->sorted_regs + (long)pgVar17 * 8 + -8);
          if ((prVar49 == (ra_ctx *)0x0) ||
             (ctx_01 = (ra_ctx *)prVar49->sorted_regs, ctx_01 == (ra_ctx *)0x0)) goto LAB_001544a4;
          prStack_128 = (ra_ctx *)0x1538ee;
          free(ctx_01);
          prStack_128 = (ra_ctx *)0x1538f6;
          free(prVar49);
          ctx_01 = prVar49;
        }
        goto LAB_001544bd;
      }
    }
    prStack_128 = (ra_ctx *)0x15458f;
    MIR_gen_finish_cold_62();
    ctx_00 = prVar45;
LAB_0015458f:
    prStack_128 = (ra_ctx *)0x154594;
    MIR_gen_finish_cold_55();
LAB_00154594:
    prVar51 = prVar49;
    prStack_128 = (ra_ctx *)0x154599;
    MIR_gen_finish_cold_54();
LAB_00154599:
    prStack_128 = (ra_ctx *)0x15459e;
    MIR_gen_finish_cold_53();
    goto LAB_0015459e;
  }
  goto LAB_00154666;
LAB_0015297f:
  puVar32 = (ulong *)((ra_ctx *)gen_ctx)->lr_gap_bitmaps[0x1f][2].els_num;
  if (puVar32 == (ulong *)0x0) goto LAB_00152f0c;
  if ((*puVar32 & 0xf) == 0) {
    pVVar30 = ((ra_ctx *)gen_ctx)->lr_gap_bitmaps[0x1f];
    puVar32 = pVVar30[2].varr;
    if (puVar32 == (ulong *)0x0) goto LAB_00152a7a;
    uVar43 = 0;
    goto LAB_001529b0;
  }
  if ((void *)puVar32[2] == (void *)0x0) goto LAB_00152f11;
  uVar43 = *puVar32 + 1;
  if (puVar32[1] < uVar43) {
    __size = (uVar43 >> 1) + uVar43;
    prStack_100 = (ra_ctx *)0x152965;
    pvVar29 = realloc((void *)puVar32[2],__size);
    puVar32[2] = (ulong)pvVar29;
    puVar32[1] = __size;
  }
  uVar43 = *puVar32;
  *puVar32 = uVar43 + 1;
  *(undefined1 *)(puVar32[2] + uVar43) = 0;
  goto LAB_0015297f;
LAB_0015391b:
  prVar31 = pgVar50->ra_ctx;
  prVar49 = (ra_ctx *)prVar31->busy_used_locs;
  if (prVar49 == (ra_ctx *)0x0) goto LAB_001544c2;
  pgVar17 = *(gen_ctx **)&prVar49->start_mem_loc;
  if (pgVar17 == (gen_ctx *)0x0) {
    ctx_01 = (ra_ctx *)prVar49->sorted_regs;
    if (ctx_01 == (ra_ctx *)0x0) goto LAB_00154670;
    prStack_128 = (ra_ctx *)0x153988;
    free(ctx_01);
    prStack_128 = (ra_ctx *)0x153990;
    free(prVar49);
    prVar31->busy_used_locs = (VARR_bitmap_t *)0x0;
    ctx_01 = prVar49;
    goto LAB_00153999;
  }
  if (prVar49->sorted_regs == (VARR_allocno_info_t *)0x0) goto LAB_001544d1;
  *(gen_ctx **)&prVar49->start_mem_loc = (gen_ctx *)((long)&pgVar17[-1].spot_attrs + 7);
  prVar49 = *(ra_ctx **)((long)prVar49->sorted_regs + (long)pgVar17 * 8 + -8);
  if ((prVar49 == (ra_ctx *)0x0) ||
     (ctx_01 = (ra_ctx *)prVar49->sorted_regs, ctx_01 == (ra_ctx *)0x0)) goto LAB_001544a9;
  prStack_128 = (ra_ctx *)0x15396c;
  free(ctx_01);
  prStack_128 = (ra_ctx *)0x153974;
  free(prVar49);
  ctx_01 = prVar49;
  goto LAB_0015391b;
LAB_00153999:
  prVar31 = pgVar50->ra_ctx;
  prVar49 = (ra_ctx *)prVar31->var_bbs;
  if (prVar49 == (ra_ctx *)0x0) goto LAB_001544c7;
  pgVar17 = *(gen_ctx **)&prVar49->start_mem_loc;
  if (pgVar17 == (gen_ctx *)0x0) {
    ctx_01 = (ra_ctx *)prVar49->sorted_regs;
    if (ctx_01 == (ra_ctx *)0x0) goto LAB_00154675;
    prStack_128 = (ra_ctx *)0x153a06;
    free(ctx_01);
    prStack_128 = (ra_ctx *)0x153a0e;
    free(prVar49);
    prVar31->var_bbs = (VARR_bitmap_t *)0x0;
    prVar31 = pgVar50->ra_ctx;
    ctx_01 = (ra_ctx *)prVar31->spill_gaps;
    if ((ctx_01 == (ra_ctx *)0x0) ||
       (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_0015458f;
    prStack_128 = (ra_ctx *)0x153a3e;
    free(prVar49);
    prStack_128 = (ra_ctx *)0x153a46;
    free(ctx_01);
    prVar31->spill_gaps = (VARR_lr_gap_t *)0x0;
    prVar31 = pgVar50->ra_ctx;
    prVar51 = (ra_ctx *)prVar31->curr_gaps;
    prVar49 = ctx_01;
    ctx_01 = prVar51;
    if ((prVar51 == (ra_ctx *)0x0) ||
       (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_00154594;
    prStack_128 = (ra_ctx *)0x153a76;
    free(prVar49);
    prStack_128 = (ra_ctx *)0x153a7e;
    free(prVar51);
    prVar31->curr_gaps = (VARR_lr_gap_t *)0x0;
    prVar31 = pgVar50->ra_ctx;
    ctx_01 = (ra_ctx *)prVar31->spill_els;
    if ((ctx_01 == (ra_ctx *)0x0) ||
       (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154599;
    prStack_128 = (ra_ctx *)0x153ab1;
    free(prVar51);
    prStack_128 = (ra_ctx *)0x153ab9;
    free(ctx_01);
    prVar31->spill_els = (VARR_spill_el_t *)0x0;
    prVar31 = (ra_ctx *)0x8;
    goto LAB_00153acb;
  }
  if (prVar49->sorted_regs == (VARR_allocno_info_t *)0x0) goto LAB_001544db;
  *(gen_ctx **)&prVar49->start_mem_loc = (gen_ctx *)((long)&pgVar17[-1].spot_attrs + 7);
  prVar49 = *(ra_ctx **)((long)prVar49->sorted_regs + (long)pgVar17 * 8 + -8);
  if ((prVar49 == (ra_ctx *)0x0) ||
     (ctx_01 = (ra_ctx *)prVar49->sorted_regs, ctx_01 == (ra_ctx *)0x0)) goto LAB_001544ae;
  prStack_128 = (ra_ctx *)0x1539ea;
  free(ctx_01);
  prStack_128 = (ra_ctx *)0x1539f2;
  free(prVar49);
  ctx_01 = prVar49;
  goto LAB_00153999;
code_r0x00153d9c:
  prStack_128 = (ra_ctx *)0x153da1;
  free(ctx_01);
  prStack_128 = (ra_ctx *)0x153da9;
  free(prVar49);
  prVar31 = (ra_ctx *)((long)&prVar31->start_mem_loc + 1);
  ctx_01 = prVar49;
  if (prVar31 == (ra_ctx *)0x20) goto code_r0x00153db2;
  goto LAB_00153d82;
code_r0x00153db2:
  prVar51 = (ra_ctx *)pgVar50->tied_regs;
  ctx_01 = prVar51;
  if ((prVar51 == (ra_ctx *)0x0) ||
     (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_001545d0;
  prStack_128 = (ra_ctx *)0x153dd1;
  free(prVar49);
  prStack_128 = (ra_ctx *)0x153dd9;
  free(prVar51);
  ctx_01 = (ra_ctx *)pgVar50->addr_regs;
  if ((ctx_01 == (ra_ctx *)0x0) ||
     (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_001545d5;
  prStack_128 = (ra_ctx *)0x153df8;
  free(prVar51);
  prStack_128 = (ra_ctx *)0x153e00;
  free(ctx_01);
  prVar49 = (ra_ctx *)pgVar50->insn_to_consider;
  prVar51 = ctx_01;
  ctx_01 = prVar49;
  if ((prVar49 == (ra_ctx *)0x0) ||
     (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_001545da;
  prStack_128 = (ra_ctx *)0x153e1f;
  free(prVar51);
  prStack_128 = (ra_ctx *)0x153e27;
  free(prVar49);
  ctx_01 = (ra_ctx *)pgVar50->call_used_hard_regs[0x13];
  if ((ctx_01 == (ra_ctx *)0x0) ||
     (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_001545df;
  prStack_128 = (ra_ctx *)0x153e49;
  free(prVar49);
  prStack_128 = (ra_ctx *)0x153e51;
  free(ctx_01);
  prVar31 = (ra_ctx *)pgVar50->target_ctx;
  prVar51 = (ra_ctx *)prVar31->used_locs;
  prVar49 = ctx_01;
  ctx_01 = prVar51;
  if ((prVar51 == (ra_ctx *)0x0) ||
     (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_001545e4;
  prStack_128 = (ra_ctx *)0x153e78;
  free(prVar49);
  prStack_128 = (ra_ctx *)0x153e80;
  free(prVar51);
  prVar31->used_locs = (VARR_bitmap_t *)0x0;
  prVar31 = (ra_ctx *)pgVar50->target_ctx;
  ctx_01 = (ra_ctx *)prVar31->var_bbs;
  if ((ctx_01 == (ra_ctx *)0x0) ||
     (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_001545e9;
  prStack_128 = (ra_ctx *)0x153eb0;
  free(prVar51);
  prStack_128 = (ra_ctx *)0x153eb8;
  free(ctx_01);
  prVar31->var_bbs = (VARR_bitmap_t *)0x0;
  prVar51 = (ra_ctx *)pgVar50->ctx;
  prVar46 = (ra_ctx *)pgVar50->target_ctx->temp_jump;
  prStack_128 = (ra_ctx *)0x153ed4;
  _MIR_free_insn((MIR_context_t)prVar51,(MIR_insn_t_conflict)prVar46);
  prVar31 = (ra_ctx *)pgVar50->target_ctx;
  prVar49 = (ra_ctx *)prVar31->spill_gaps;
  ctx_01 = prVar49;
  if ((prVar49 == (ra_ctx *)0x0) ||
     (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_001545ee;
  prStack_128 = (ra_ctx *)0x153efb;
  free(prVar51);
  prStack_128 = (ra_ctx *)0x153f03;
  free(prVar49);
  prVar31->spill_gaps = (VARR_lr_gap_t *)0x0;
  prVar31 = (ra_ctx *)pgVar50->target_ctx;
  ctx_01 = (ra_ctx *)prVar31->busy_used_locs;
  if ((ctx_01 == (ra_ctx *)0x0) ||
     (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_001545f3;
  prStack_128 = (ra_ctx *)0x153f33;
  free(prVar49);
  prStack_128 = (ra_ctx *)0x153f3b;
  free(ctx_01);
  prVar31->busy_used_locs = (VARR_bitmap_t *)0x0;
  prVar31 = (ra_ctx *)pgVar50->target_ctx;
  prVar51 = (ra_ctx *)prVar31->curr_gaps;
  prVar49 = ctx_01;
  ctx_01 = prVar51;
  if ((prVar51 == (ra_ctx *)0x0) ||
     (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_001545f8;
  prStack_128 = (ra_ctx *)0x153f6b;
  free(prVar49);
  prStack_128 = (ra_ctx *)0x153f73;
  free(prVar51);
  prVar31->curr_gaps = (VARR_lr_gap_t *)0x0;
  prVar31 = (ra_ctx *)pgVar50->target_ctx;
  ctx_01 = (ra_ctx *)prVar31->lr_gap_bitmaps[0];
  if ((ctx_01 == (ra_ctx *)0x0) ||
     (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_001545fd;
  prStack_128 = (ra_ctx *)0x153fa3;
  free(prVar51);
  prStack_128 = (ra_ctx *)0x153fab;
  free(ctx_01);
  prVar31->lr_gap_bitmaps[0] = (bitmap_t)0x0;
  prVar31 = (ra_ctx *)pgVar50->target_ctx;
  prVar49 = (ra_ctx *)prVar31->lr_gap_bitmaps[1];
  prVar51 = ctx_01;
  ctx_01 = prVar49;
  if ((prVar49 == (ra_ctx *)0x0) ||
     (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154602;
  prStack_128 = (ra_ctx *)0x153fdb;
  free(prVar51);
  prStack_128 = (ra_ctx *)0x153fe3;
  free(prVar49);
  prVar31->lr_gap_bitmaps[1] = (bitmap_t)0x0;
  prVar31 = (ra_ctx *)pgVar50->target_ctx;
  ctx_01 = (ra_ctx *)prVar31->lr_gap_bitmaps[2];
  if ((ctx_01 == (ra_ctx *)0x0) ||
     (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_00154607;
  prStack_128 = (ra_ctx *)0x154013;
  free(prVar49);
  prStack_128 = (ra_ctx *)0x15401b;
  free(ctx_01);
  prVar31->lr_gap_bitmaps[2] = (bitmap_t)0x0;
  prVar31 = (ra_ctx *)pgVar50->target_ctx;
  prVar51 = (ra_ctx *)prVar31->lr_gap_bitmaps[3];
  prVar49 = ctx_01;
  ctx_01 = prVar51;
  if ((prVar51 == (ra_ctx *)0x0) ||
     (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_0015460c;
  prStack_128 = (ra_ctx *)0x15404b;
  free(prVar49);
  prStack_128 = (ra_ctx *)0x154053;
  free(prVar51);
  prVar31->lr_gap_bitmaps[3] = (bitmap_t)0x0;
  prVar31 = (ra_ctx *)pgVar50->target_ctx;
  ctx_01 = (ra_ctx *)prVar31->lr_gap_bitmaps[4];
  if ((ctx_01 == (ra_ctx *)0x0) ||
     (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154611;
  prStack_128 = (ra_ctx *)0x154083;
  free(prVar51);
  prStack_128 = (ra_ctx *)0x15408b;
  free(ctx_01);
  prVar31->lr_gap_bitmaps[4] = (bitmap_t)0x0;
  prStack_128 = (ra_ctx *)0x15409f;
  free(pgVar50->target_ctx);
  pgVar50->target_ctx = (target_ctx *)0x0;
  ctx_01 = (ra_ctx *)(pgVar50->free_dead_vars).head;
  if (ctx_01 != (ra_ctx *)0x0) {
    prVar49 = (ra_ctx *)&pgVar50->free_dead_vars;
    prVar31 = (ra_ctx *)&(pgVar50->free_dead_vars).tail;
    do {
      p_Var54 = (_IO_FILE *)ctx_01->reg_renumber;
      pDVar40 = (DLIST_dead_var_t *)&p_Var54->_IO_read_end;
      if (p_Var54 == (_IO_FILE *)0x0) {
        pDVar40 = (DLIST_dead_var_t *)prVar49;
      }
      pDVar40->head = (dead_var_t_conflict)ctx_01->sorted_regs;
      if (ctx_01->sorted_regs == (VARR_allocno_info_t *)0x0) {
        ppdVar35 = (dead_var_t_conflict *)prVar31;
        if (*(ra_ctx **)prVar31 != ctx_01) goto LAB_001544e0;
      }
      else {
        ppdVar35 = (dead_var_t_conflict *)&ctx_01->sorted_regs->size;
      }
      *ppdVar35 = (dead_var_t_conflict)p_Var54;
      ctx_01->reg_renumber = (VARR_MIR_reg_t *)0x0;
      ctx_01->sorted_regs = (VARR_allocno_info_t *)0x0;
      prStack_128 = (ra_ctx *)0x154106;
      free(ctx_01);
      ctx_01 = (ra_ctx *)((DLIST_dead_var_t *)prVar49)->head;
    } while (ctx_01 != (ra_ctx *)0x0);
  }
  prVar51 = (ra_ctx *)pgVar50->data_flow_ctx;
  prStack_128 = (ra_ctx *)0x15411a;
  free(prVar51);
  prVar49 = (ra_ctx *)pgVar50->temp_bitmap;
  ctx_01 = prVar49;
  if ((prVar49 == (ra_ctx *)0x0) ||
     (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154616;
  prStack_128 = (ra_ctx *)0x154139;
  free(prVar51);
  prStack_128 = (ra_ctx *)0x154141;
  free(prVar49);
  ctx_01 = (ra_ctx *)pgVar50->temp_bitmap2;
  if ((ctx_01 == (ra_ctx *)0x0) ||
     (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_0015461b;
  prStack_128 = (ra_ctx *)0x154160;
  free(prVar49);
  prStack_128 = (ra_ctx *)0x154168;
  free(ctx_01);
  prVar51 = (ra_ctx *)pgVar50->temp_bitmap3;
  prVar49 = ctx_01;
  ctx_01 = prVar51;
  if ((prVar51 == (ra_ctx *)0x0) ||
     (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_00154620;
  prStack_128 = (ra_ctx *)0x154187;
  free(prVar49);
  prStack_128 = (ra_ctx *)0x15418f;
  free(prVar51);
  ctx_01 = (ra_ctx *)pgVar50->temp_ops;
  if ((ctx_01 == (ra_ctx *)0x0) ||
     (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154625;
  prStack_128 = (ra_ctx *)0x1541b1;
  free(prVar51);
  prStack_128 = (ra_ctx *)0x1541b9;
  free(ctx_01);
  pgVar50->temp_ops = (VARR_MIR_op_t *)0x0;
  prVar49 = (ra_ctx *)pgVar50->temp_insns;
  prVar51 = ctx_01;
  ctx_01 = prVar49;
  if ((prVar49 == (ra_ctx *)0x0) ||
     (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_0015462a;
  prStack_128 = (ra_ctx *)0x1541e6;
  free(prVar51);
  prStack_128 = (ra_ctx *)0x1541ee;
  free(prVar49);
  pgVar50->temp_insns = (VARR_MIR_insn_t *)0x0;
  ctx_01 = (ra_ctx *)pgVar50->temp_insns2;
  if ((ctx_01 == (ra_ctx *)0x0) ||
     (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_0015462f;
  prStack_128 = (ra_ctx *)0x15421b;
  free(prVar49);
  prStack_128 = (ra_ctx *)0x154223;
  free(ctx_01);
  pgVar50->temp_insns2 = (VARR_MIR_insn_t *)0x0;
  prVar51 = (ra_ctx *)pgVar50->temp_bb_insns;
  prVar49 = ctx_01;
  ctx_01 = prVar51;
  if ((prVar51 == (ra_ctx *)0x0) ||
     (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_00154634;
  prStack_128 = (ra_ctx *)0x154250;
  free(prVar49);
  prStack_128 = (ra_ctx *)0x154258;
  free(prVar51);
  pgVar50->temp_bb_insns = (VARR_bb_insn_t *)0x0;
  ctx_01 = (ra_ctx *)pgVar50->temp_bb_insns2;
  if ((ctx_01 == (ra_ctx *)0x0) ||
     (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154639;
  prStack_128 = (ra_ctx *)0x154285;
  free(prVar51);
  prStack_128 = (ra_ctx *)0x15428d;
  free(ctx_01);
  pgVar50->temp_bb_insns2 = (VARR_bb_insn_t *)0x0;
  prVar49 = (ra_ctx *)pgVar50->loop_nodes;
  prVar51 = ctx_01;
  ctx_01 = prVar49;
  if ((prVar49 == (ra_ctx *)0x0) ||
     (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_0015463e;
  prStack_128 = (ra_ctx *)0x1542ba;
  free(prVar51);
  prStack_128 = (ra_ctx *)0x1542c2;
  free(prVar49);
  pgVar50->loop_nodes = (VARR_loop_node_t *)0x0;
  ctx_01 = (ra_ctx *)pgVar50->queue_nodes;
  if ((ctx_01 == (ra_ctx *)0x0) ||
     (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_00154643;
  prStack_128 = (ra_ctx *)0x1542ef;
  free(prVar49);
  prStack_128 = (ra_ctx *)0x1542f7;
  free(ctx_01);
  pgVar50->queue_nodes = (VARR_loop_node_t *)0x0;
  prVar51 = (ra_ctx *)pgVar50->loop_entries;
  prVar49 = ctx_01;
  ctx_01 = prVar51;
  if ((prVar51 == (ra_ctx *)0x0) ||
     (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_00154648;
  prStack_128 = (ra_ctx *)0x154324;
  free(prVar49);
  prStack_128 = (ra_ctx *)0x15432c;
  free(prVar51);
  pgVar50->loop_entries = (VARR_loop_node_t *)0x0;
  ctx_01 = (ra_ctx *)pgVar50->mem_attrs;
  if ((ctx_01 == (ra_ctx *)0x0) ||
     (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_0015464d;
  prStack_128 = (ra_ctx *)0x154359;
  free(prVar51);
  prStack_128 = (ra_ctx *)0x154361;
  free(ctx_01);
  pgVar50->mem_attrs = (VARR_mem_attr_t *)0x0;
  prVar49 = (ra_ctx *)pgVar50->target_succ_bb_versions;
  prVar51 = ctx_01;
  ctx_01 = prVar49;
  if ((prVar49 == (ra_ctx *)0x0) ||
     (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_00154652;
  prStack_128 = (ra_ctx *)0x15438e;
  free(prVar51);
  prStack_128 = (ra_ctx *)0x154396;
  free(prVar49);
  pgVar50->target_succ_bb_versions = (VARR_target_bb_version_t *)0x0;
  ctx_01 = (ra_ctx *)pgVar50->succ_bb_addrs;
  if ((ctx_01 == (ra_ctx *)0x0) ||
     (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_00154657;
  prStack_128 = (ra_ctx *)0x1543c3;
  free(prVar49);
  prStack_128 = (ra_ctx *)0x1543cb;
  free(ctx_01);
  pgVar50->succ_bb_addrs = (VARR_void_ptr_t *)0x0;
  prVar51 = (ra_ctx *)pgVar50->spot_attrs;
  prVar49 = ctx_01;
  ctx_01 = prVar51;
  if ((prVar51 == (ra_ctx *)0x0) ||
     (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_0015465c;
  prStack_128 = (ra_ctx *)0x1543f8;
  free(prVar49);
  prStack_128 = (ra_ctx *)0x154400;
  free(prVar51);
  pgVar50->spot_attrs = (VARR_spot_attr_t *)0x0;
  ctx_01 = (ra_ctx *)pgVar50->spot2attr;
  prVar49 = ctx_01;
  if ((ctx_01 != (ra_ctx *)0x0) &&
     (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 != (ra_ctx *)0x0)) {
    prStack_128 = (ra_ctx *)0x15442d;
    free(prVar51);
    prStack_128 = (ra_ctx *)0x154435;
    free(ctx_01);
    pgVar50->spot2attr = (VARR_spot_attr_t *)0x0;
    while (prVar49 = (ra_ctx *)pgVar50->to_free, prVar49 != (ra_ctx *)0x0) {
      pgVar17 = *(gen_ctx **)&prVar49->start_mem_loc;
      ctx_01 = (ra_ctx *)prVar49->sorted_regs;
      if (pgVar17 == (gen_ctx *)0x0) {
        if (ctx_01 != (ra_ctx *)0x0) {
          prStack_128 = (ra_ctx *)0x15447b;
          free(ctx_01);
          prStack_128 = (ra_ctx *)0x154483;
          free(prVar49);
          pgVar50->to_free = (VARR_void_ptr_t *)0x0;
          prStack_128 = (ra_ctx *)0x154492;
          free(pgVar50);
          *(gen_ctx **)&ctx_00->start_mem_loc = (gen_ctx *)0x0;
          return extraout_RAX_01;
        }
        goto LAB_0015467a;
      }
      if (ctx_01 == (ra_ctx *)0x0) goto LAB_001544b8;
      *(gen_ctx **)&prVar49->start_mem_loc = (gen_ctx *)((long)&pgVar17[-1].spot_attrs + 7);
      ctx_01 = (ra_ctx *)ctx_01->lr_gap_bitmaps[(long)((long)&pgVar17[-1].spot2attr + 7)];
      prStack_128 = (ra_ctx *)0x15446b;
      free(ctx_01);
    }
LAB_001544b3:
    prStack_128 = (ra_ctx *)0x1544b8;
    MIR_gen_finish_cold_11();
LAB_001544b8:
    prStack_128 = (ra_ctx *)0x1544bd;
    MIR_gen_finish_cold_9();
LAB_001544bd:
    prStack_128 = (ra_ctx *)0x1544c2;
    MIR_gen_finish_cold_61();
LAB_001544c2:
    prStack_128 = (ra_ctx *)0x1544c7;
    MIR_gen_finish_cold_59();
LAB_001544c7:
    prStack_128 = (ra_ctx *)0x1544cc;
    MIR_gen_finish_cold_57();
LAB_001544cc:
    prStack_128 = (ra_ctx *)0x1544d1;
    MIR_gen_finish_cold_2();
LAB_001544d1:
    prStack_128 = (ra_ctx *)0x1544d6;
    MIR_gen_finish_cold_4();
LAB_001544d6:
    prStack_128 = (ra_ctx *)0x1544db;
    MIR_gen_finish_cold_7();
LAB_001544db:
    prStack_128 = (ra_ctx *)0x1544e0;
    MIR_gen_finish_cold_6();
LAB_001544e0:
    prStack_128 = (ra_ctx *)0x1544e5;
    MIR_gen_finish_cold_8();
    goto LAB_001544e5;
  }
  goto LAB_00154661;
  while( true ) {
    uVar34 = puVar32[2];
    if (uVar34 == 0) goto LAB_00152f16;
    plVar9 = (long *)pVVar30[2].els_num;
    if (plVar9 == (long *)0x0) goto LAB_00152f1b;
    uVar52 = *(ulong *)(uVar34 + uVar43 * 0x28 + 0x20);
    puVar37 = (undefined1 *)(plVar9[2] + *(long *)(uVar34 + uVar43 * 0x28 + 0x10));
    lVar44 = *plVar9 - *(long *)(uVar34 + uVar43 * 0x28 + 0x18);
    uVar23 = 5;
    do {
      *puVar37 = (char)lVar44;
      puVar37 = puVar37 + 1;
      lVar44 = lVar44 >> 8;
      uVar23 = uVar23 - 1;
    } while (1 < uVar23);
    puVar32 = (ulong *)((ra_ctx *)gen_ctx)->lr_gap_bitmaps[0x1f][2].size;
    if (((puVar32 == (ulong *)0x0) || (puVar32[2] == 0)) || (*puVar32 <= uVar52)) goto LAB_00152ef8;
    uVar34 = *(ulong *)(puVar32[2] + uVar52 * 8);
    uVar23 = 9;
    do {
      prStack_100 = (ra_ctx *)0x152a42;
      put_byte(gen_ctx,(uint)uVar34 & 0xff);
      uVar34 = uVar34 >> 8;
      uVar23 = uVar23 - 1;
    } while (1 < uVar23);
    uVar23 = 9;
    do {
      prStack_100 = (ra_ctx *)0x152a5c;
      put_byte(gen_ctx,0);
      uVar23 = uVar23 - 1;
    } while (1 < uVar23);
    uVar43 = uVar43 + 1;
    pVVar30 = ((ra_ctx *)gen_ctx)->lr_gap_bitmaps[0x1f];
    puVar32 = pVVar30[2].varr;
    if (puVar32 == (ulong *)0x0) break;
LAB_001529b0:
    if (*puVar32 <= uVar43) goto LAB_00152a7f;
  }
LAB_00152a7a:
  prStack_100 = (ra_ctx *)0x152a7f;
  bb_version_generator_cold_36();
  pVVar30 = extraout_RAX;
LAB_00152a7f:
  puVar8 = (undefined8 *)pVVar30[2].els_num;
  if (puVar8 == (undefined8 *)0x0) {
LAB_00152fc7:
    prStack_100 = (ra_ctx *)0x152fcc;
    bb_version_generator_cold_32();
LAB_00152fcc:
    prStack_100 = (ra_ctx *)0x152fd1;
    bb_version_generator_cold_25();
  }
  else {
    local_c0 = (ra_ctx *)*puVar8;
    prStack_100 = (ra_ctx *)0x152aa2;
    prVar31 = (ra_ctx *)
              _MIR_publish_code((MIR_context_t)local_b8,(uint8_t *)puVar8[2],(size_t)local_c0);
    puVar32 = (ulong *)((ra_ctx *)gen_ctx)->lr_gap_bitmaps[0x1f][3].els_num;
    local_a8._0_8_ = prVar31;
    if (puVar32 != (ulong *)0x0) {
      ctx = *(MIR_context_t *)&((ra_ctx *)gen_ctx)->start_mem_loc;
      uVar43 = 0xffffffffffffffff;
      lVar44 = 0;
      do {
        uVar43 = uVar43 + 1;
        if (*puVar32 <= uVar43) goto LAB_00152b67;
        if ((puVar32[2] == 0) || (*puVar32 <= uVar43)) goto LAB_00152f02;
        puVar8 = (undefined8 *)(puVar32[2] + lVar44);
        local_98._64_8_ = *puVar8;
        pVStack_50 = (bitmap_t)puVar8[1];
        pVStack_48 = (bitmap_t)puVar8[2];
        aStack_40 = (anon_union_8_2_369d9a33_for_u)
                    ((anon_union_8_2_369d9a33_for_u *)(puVar8 + 3))->jump_addr;
        if (local_98[0x40] == '\0') {
          prStack_100 = (ra_ctx *)0x152b4a;
          setup_rel32(gen_ctx,(label_ref_t *)(local_98 + 0x40),(uint8_t *)prVar31,
                      aStack_40.jump_addr);
        }
        else {
          prStack_100 = (ra_ctx *)0x152b2a;
          _MIR_change_code(ctx,(uint8_t *)
                               ((long)&(pVStack_50 + -5)[2].size + (long)prVar31->lr_gap_bitmaps),
                           (uint8_t *)&aStack_40,8);
        }
        lVar44 = lVar44 + 0x20;
        puVar32 = (ulong *)((ra_ctx *)gen_ctx)->lr_gap_bitmaps[0x1f][3].els_num;
      } while (puVar32 != (ulong *)0x0);
    }
    prStack_100 = (ra_ctx *)0x152b67;
    bb_version_generator_cold_31();
LAB_00152b67:
    prStack_100 = (ra_ctx *)0x152b72;
    change_calls(gen_ctx,(uint8_t *)prVar31);
    pVVar30 = ((ra_ctx *)gen_ctx)->lr_gap_bitmaps[0x1f];
    pbVar13 = pVVar30[3].varr;
    if ((pbVar13 == (bitmap_el_t *)0x0) || (pbVar13[2] == 0)) goto LAB_00152f99;
    *pbVar13 = 0;
    puVar32 = (ulong *)pVVar30[3].size;
    if (puVar32 != (ulong *)0x0) {
      uVar43 = 0;
      do {
        if (*puVar32 <= uVar43) goto LAB_00152c5f;
        if (puVar32[2] == 0) goto LAB_00152f25;
        lVar44 = *(long *)(puVar32[2] + uVar43 * 8);
        lVar38 = 8;
        uVar34 = 0;
        do {
          uVar34 = (ulong)*(byte *)((long)prVar31->lr_gap_bitmaps + lVar38 + lVar44 + -0x41) |
                   uVar34 << 8;
          lVar38 = lVar38 + -1;
        } while (lVar38 != 0);
        pbVar13 = pVVar30[3].varr;
        if ((void *)pbVar13[2] == (void *)0x0) goto LAB_00152f20;
        uVar52 = *pbVar13 + 1;
        if (pbVar13[1] < uVar52) {
          bVar55 = (uVar52 >> 1) + uVar52;
          prStack_100 = (ra_ctx *)0x152c16;
          pvVar29 = realloc((void *)pbVar13[2],bVar55 * 0x10);
          pbVar13[2] = (bitmap_el_t)pvVar29;
          pbVar13[1] = bVar55;
          gen_ctx = (gen_ctx_t)local_b0;
        }
        bVar55 = *pbVar13;
        bVar14 = pbVar13[2];
        *pbVar13 = bVar55 + 1;
        *(long *)(bVar14 + bVar55 * 0x10) = lVar44;
        *(ulong *)(bVar14 + bVar55 * 0x10 + 8) = (long)prVar31->lr_gap_bitmaps + (uVar34 - 0x40);
        uVar43 = uVar43 + 1;
        pVVar30 = ((ra_ctx *)gen_ctx)->lr_gap_bitmaps[0x1f];
        puVar32 = (ulong *)pVVar30[3].size;
      } while (puVar32 != (ulong *)0x0);
    }
    prStack_100 = (ra_ctx *)0x152c5f;
    bb_version_generator_cold_28();
    pVVar30 = extraout_RAX_00;
LAB_00152c5f:
    psVar15 = pVVar30[3].varr;
    if (psVar15 == (size_t *)0x0) goto LAB_00152fcc;
    prStack_100 = (ra_ctx *)0x152c7e;
    _MIR_update_code_arr
              (*(MIR_context_t *)&((ra_ctx *)gen_ctx)->start_mem_loc,(uint8_t *)prVar31,*psVar15,
               (MIR_code_reloc_t *)psVar15[2]);
    puVar32 = (ulong *)((ra_ctx *)gen_ctx)->lr_gap_bitmaps[0x1f][3].els_num;
    if (puVar32 != (ulong *)0x0) {
      puVar39 = *(ulong **)&((ra_ctx *)gen_ctx)->in_reloads[6].hreg;
      if (puVar39 != (ulong *)0x0) {
        if (*puVar32 == *puVar39) {
          lVar44 = 0;
          uVar43 = 0;
          do {
            if (*puVar39 <= uVar43) goto LAB_00152d1e;
            if (puVar39[2] == 0) goto LAB_00152f32;
            puVar8 = *(undefined8 **)(puVar39[2] + uVar43 * 8);
            if (puVar8 != (undefined8 *)0x0) {
              puVar32 = (ulong *)((ra_ctx *)gen_ctx)->lr_gap_bitmaps[0x1f][3].els_num;
              if (((puVar32 == (ulong *)0x0) || (puVar32[2] == 0)) || (*puVar32 <= uVar43))
              goto LAB_00152f2a;
              puVar1 = (undefined8 *)(puVar32[2] + lVar44);
              uVar10 = puVar1[1];
              uVar20 = puVar1[2];
              uVar21 = puVar1[3];
              puVar8[1] = *puVar1;
              puVar8[2] = uVar10;
              puVar8[3] = uVar20;
              puVar8[4] = uVar21;
              *puVar8 = prVar31;
            }
            uVar43 = uVar43 + 1;
            puVar39 = *(ulong **)&((ra_ctx *)gen_ctx)->in_reloads[6].hreg;
            lVar44 = lVar44 + 0x20;
          } while (puVar39 != (ulong *)0x0);
          prStack_100 = (ra_ctx *)0x152d1e;
          bb_version_generator_cold_21();
        }
LAB_00152d1e:
        prVar46 = local_c0;
        if ((((ra_ctx *)gen_ctx)->used_locs != (VARR_bitmap_t *)0x0) &&
           (0 < *(int *)&((ra_ctx *)gen_ctx)->busy_used_locs)) {
          prStack_100 = (ra_ctx *)0x152d41;
          _MIR_dump_code((char *)0x0,(uint8_t *)prVar31,(size_t)local_c0);
          prStack_100 = (ra_ctx *)0x152d5b;
          fprintf((FILE *)((ra_ctx *)gen_ctx)->used_locs,"BBStub%llx code size = %lu:\n",
                  local_98._16_8_,prVar46);
        }
        uVar10 = local_98._40_8_;
        puVar47 = ((target_bb_version *)(local_98._40_8_ + 0x30))->base;
        local_98._64_8_ = prVar31;
        if (puVar47 != (uint8_t *)0x0) {
          if ((((target_bb_version *)(local_98._40_8_ + 0x30))->branch_ref).abs_addr_p == '\0') {
            prStack_100 = (ra_ctx *)0x152db0;
            setup_rel32(gen_ctx,&((target_bb_version *)(local_98._40_8_ + 0x30))->branch_ref,puVar47
                        ,prVar31);
          }
          else {
            prStack_100 = (ra_ctx *)0x152d99;
            _MIR_change_code(*(MIR_context_t *)&((ra_ctx *)gen_ctx)->start_mem_loc,
                             puVar47 + (((target_bb_version *)(local_98._40_8_ + 0x30))->branch_ref)
                                       .label_val_disp,local_98 + 0x40,8);
          }
          ((target_bb_version *)(uVar10 + 0x30))->base = (uint8_t *)0x0;
        }
        prStack_100 = (ra_ctx *)0x152dcc;
        _MIR_replace_bb_thunk((MIR_context_t)local_b8,*(void **)(uVar10 + 0x20),prVar31);
        *(ra_ctx **)(uVar10 + 0x20) = prVar31;
        ((ra_ctx *)gen_ctx)->lr_gap_bitmaps[0x1e] =
             (bitmap_t)((long)&((ra_ctx *)gen_ctx)->lr_gap_bitmaps[0x1e]->els_num + 1);
        *(ra_ctx **)(uVar10 + 0x28) = prVar31;
        return prVar31;
      }
      goto LAB_00152fd6;
    }
  }
  prStack_100 = (ra_ctx *)0x152fd6;
  bb_version_generator_cold_24();
LAB_00152fd6:
  prStack_100 = (ra_ctx *)0x152fdb;
  bb_version_generator_cold_23();
LAB_00152fdb:
  prStack_100 = (ra_ctx *)0x152fe0;
  bb_version_generator_cold_15();
LAB_00152fe0:
  prStack_100 = (ra_ctx *)0x152fe5;
  bb_version_generator_cold_14();
LAB_00152fe5:
  prStack_100 = (ra_ctx *)0x152fea;
  bb_version_generator_cold_13();
LAB_00152fea:
  prStack_100 = (ra_ctx *)0x153009;
  __assert_fail("curr_insn->ops[1].mode == MIR_OP_INT || curr_insn->ops[1].mode == MIR_OP_UINT",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x263a,"void generate_bb_version_machine_code(gen_ctx_t, bb_version_t)");
LAB_00153acb:
  do {
    prVar49 = *(ra_ctx **)(&pgVar50->ra_ctx->start_mem_loc + (long)prVar31 * 2);
    if (prVar49 != (ra_ctx *)0x0) {
      ctx_01 = (ra_ctx *)prVar49->sorted_regs;
      if (ctx_01 == (ra_ctx *)0x0) goto LAB_001544d6;
      prStack_128 = (ra_ctx *)0x153aed;
      free(ctx_01);
      prStack_128 = (ra_ctx *)0x153af5;
      free(prVar49);
    }
    prVar31 = (ra_ctx *)((long)&prVar31->start_mem_loc + 1);
  } while (prVar31 != (ra_ctx *)0x2a);
  prVar31 = pgVar50->ra_ctx;
  prVar51 = (ra_ctx *)prVar31->lr_gap_tab;
  if (prVar51->var_bbs != (VARR_bitmap_t *)0x0) {
    prStack_128 = (ra_ctx *)0x153b19;
    HTAB_lr_gap_t_clear((HTAB_lr_gap_t *)prVar51);
  }
  unaff_R13 = (ra_ctx *)prVar31->lr_gap_tab;
  prVar49 = (ra_ctx *)unaff_R13->spill_gaps;
  ctx_01 = prVar49;
  if ((prVar49 == (ra_ctx *)0x0) ||
     (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) {
LAB_0015459e:
    prVar49 = prVar51;
    prStack_128 = (ra_ctx *)0x1545a3;
    MIR_gen_finish_cold_52();
LAB_001545a3:
    prStack_128 = (ra_ctx *)0x1545a8;
    MIR_gen_finish_cold_51();
LAB_001545a8:
    prVar51 = prVar49;
    prStack_128 = (ra_ctx *)0x1545ad;
    MIR_gen_finish_cold_50();
LAB_001545ad:
    prStack_128 = (ra_ctx *)0x1545b2;
    MIR_gen_finish_cold_49();
LAB_001545b2:
    prVar49 = prVar51;
    prStack_128 = (ra_ctx *)0x1545b7;
    MIR_gen_finish_cold_48();
LAB_001545b7:
    prStack_128 = (ra_ctx *)0x1545bc;
    MIR_gen_finish_cold_47();
LAB_001545bc:
    prVar51 = prVar49;
    prStack_128 = (ra_ctx *)0x1545c1;
    MIR_gen_finish_cold_46();
LAB_001545c1:
    prStack_128 = (ra_ctx *)0x1545c6;
    MIR_gen_finish_cold_45();
LAB_001545c6:
    prVar49 = prVar51;
    prStack_128 = (ra_ctx *)0x1545cb;
    MIR_gen_finish_cold_44();
  }
  else {
    prStack_128 = (ra_ctx *)0x153b40;
    free(prVar51);
    prStack_128 = (ra_ctx *)0x153b48;
    free(prVar49);
    unaff_R13->spill_gaps = (VARR_lr_gap_t *)0x0;
    unaff_R13 = (ra_ctx *)prVar31->lr_gap_tab;
    ctx_01 = (ra_ctx *)unaff_R13->curr_gaps;
    if ((ctx_01 == (ra_ctx *)0x0) ||
       (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_001545a3;
    prStack_128 = (ra_ctx *)0x153b77;
    free(prVar49);
    prStack_128 = (ra_ctx *)0x153b7f;
    free(ctx_01);
    unaff_R13->curr_gaps = (VARR_lr_gap_t *)0x0;
    prVar49 = (ra_ctx *)prVar31->lr_gap_tab;
    prStack_128 = (ra_ctx *)0x153b93;
    free(prVar49);
    prVar31->lr_gap_tab = (HTAB_lr_gap_t *)0x0;
    prVar31 = pgVar50->ra_ctx;
    prVar51 = (ra_ctx *)prVar31->spill_cache;
    ctx_01 = prVar51;
    if ((prVar51 == (ra_ctx *)0x0) ||
       (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_001545a8;
    prStack_128 = (ra_ctx *)0x153bc5;
    free(prVar49);
    prStack_128 = (ra_ctx *)0x153bcd;
    free(prVar51);
    prVar31->spill_cache = (VARR_spill_cache_el_t *)0x0;
    ctx_01 = (ra_ctx *)pgVar50->ra_ctx->conflict_locs1;
    if ((ctx_01 == (ra_ctx *)0x0) ||
       (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_001545ad;
    prStack_128 = (ra_ctx *)0x153c02;
    free(prVar51);
    prStack_128 = (ra_ctx *)0x153c0a;
    free(ctx_01);
    prVar51 = pgVar50->ra_ctx;
    prStack_128 = (ra_ctx *)0x153c16;
    free(prVar51);
    pgVar50->ra_ctx = (ra_ctx *)0x0;
    prVar31 = (ra_ctx *)pgVar50->combine_ctx;
    prVar49 = *(ra_ctx **)prVar31;
    ctx_01 = prVar49;
    if ((prVar49 == (ra_ctx *)0x0) ||
       (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_001545b2;
    prStack_128 = (ra_ctx *)0x153c47;
    free(prVar51);
    prStack_128 = (ra_ctx *)0x153c4f;
    free(prVar49);
    *(ulong *)prVar31 = 0;
    prVar31 = (ra_ctx *)pgVar50->combine_ctx;
    ctx_01 = (ra_ctx *)prVar31->reg_renumber;
    if ((ctx_01 == (ra_ctx *)0x0) ||
       (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_001545b7;
    prStack_128 = (ra_ctx *)0x153c7e;
    free(prVar49);
    prStack_128 = (ra_ctx *)0x153c86;
    free(ctx_01);
    prVar31->reg_renumber = (VARR_MIR_reg_t *)0x0;
    prVar31 = (ra_ctx *)pgVar50->combine_ctx;
    prVar51 = (ra_ctx *)prVar31->spill_gaps;
    prVar49 = ctx_01;
    ctx_01 = prVar51;
    if ((prVar51 == (ra_ctx *)0x0) ||
       (prVar49 = (ra_ctx *)prVar51->sorted_regs, prVar49 == (ra_ctx *)0x0)) goto LAB_001545bc;
    prStack_128 = (ra_ctx *)0x153cb6;
    free(prVar49);
    prStack_128 = (ra_ctx *)0x153cbe;
    free(prVar51);
    prVar31->spill_gaps = (VARR_lr_gap_t *)0x0;
    prVar31 = (ra_ctx *)pgVar50->combine_ctx;
    ctx_01 = (ra_ctx *)prVar31->curr_gaps;
    if ((ctx_01 == (ra_ctx *)0x0) ||
       (prVar51 = (ra_ctx *)ctx_01->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_001545c1;
    prStack_128 = (ra_ctx *)0x153cee;
    free(prVar51);
    prStack_128 = (ra_ctx *)0x153cf6;
    free(ctx_01);
    prVar31->curr_gaps = (VARR_lr_gap_t *)0x0;
    prVar31 = (ra_ctx *)pgVar50->combine_ctx;
    prVar49 = (ra_ctx *)prVar31->lr_gap_bitmaps[0];
    prVar51 = ctx_01;
    ctx_01 = prVar49;
    if ((prVar49 == (ra_ctx *)0x0) ||
       (prVar51 = (ra_ctx *)prVar49->sorted_regs, prVar51 == (ra_ctx *)0x0)) goto LAB_001545c6;
    prStack_128 = (ra_ctx *)0x153d26;
    free(prVar51);
    prStack_128 = (ra_ctx *)0x153d2e;
    free(prVar49);
    prVar31->lr_gap_bitmaps[0] = (bitmap_t)0x0;
    ctx_01 = (ra_ctx *)pgVar50->combine_ctx->vars_bitmap;
    if ((ctx_01 != (ra_ctx *)0x0) &&
       (prVar49 = (ra_ctx *)ctx_01->sorted_regs, prVar49 != (ra_ctx *)0x0)) {
      prStack_128 = (ra_ctx *)0x153d5d;
      free(prVar49);
      prStack_128 = (ra_ctx *)0x153d65;
      free(ctx_01);
      ctx_01 = (ra_ctx *)pgVar50->combine_ctx;
      prStack_128 = (ra_ctx *)0x153d71;
      free(ctx_01);
      pgVar50->combine_ctx = (combine_ctx *)0x0;
      prVar31 = (ra_ctx *)0xd;
LAB_00153d82:
      prVar49 = (ra_ctx *)(&pgVar50->ctx)[(long)prVar31];
      if ((prVar49 != (ra_ctx *)0x0) &&
         (ctx_01 = (ra_ctx *)prVar49->sorted_regs, ctx_01 != (ra_ctx *)0x0)) goto code_r0x00153d9c;
      prStack_128 = (ra_ctx *)0x1544a4;
      MIR_gen_finish_cold_42();
LAB_001544a4:
      prStack_128 = (ra_ctx *)0x1544a9;
      MIR_gen_finish_cold_1();
LAB_001544a9:
      prStack_128 = (ra_ctx *)0x1544ae;
      MIR_gen_finish_cold_3();
LAB_001544ae:
      prStack_128 = (ra_ctx *)0x1544b3;
      MIR_gen_finish_cold_5();
      goto LAB_001544b3;
    }
  }
  prStack_128 = (ra_ctx *)0x1545d0;
  MIR_gen_finish_cold_43();
LAB_001545d0:
  prVar51 = prVar49;
  prStack_128 = (ra_ctx *)0x1545d5;
  MIR_gen_finish_cold_41();
LAB_001545d5:
  prStack_128 = (ra_ctx *)0x1545da;
  MIR_gen_finish_cold_40();
LAB_001545da:
  prVar49 = prVar51;
  prStack_128 = (ra_ctx *)0x1545df;
  MIR_gen_finish_cold_39();
LAB_001545df:
  prStack_128 = (ra_ctx *)0x1545e4;
  MIR_gen_finish_cold_38();
LAB_001545e4:
  prVar51 = prVar49;
  prStack_128 = (ra_ctx *)0x1545e9;
  MIR_gen_finish_cold_37();
LAB_001545e9:
  prStack_128 = (ra_ctx *)0x1545ee;
  MIR_gen_finish_cold_36();
LAB_001545ee:
  prVar49 = prVar51;
  prStack_128 = (ra_ctx *)0x1545f3;
  MIR_gen_finish_cold_35();
LAB_001545f3:
  prStack_128 = (ra_ctx *)0x1545f8;
  MIR_gen_finish_cold_34();
LAB_001545f8:
  prVar51 = prVar49;
  prStack_128 = (ra_ctx *)0x1545fd;
  MIR_gen_finish_cold_33();
LAB_001545fd:
  prStack_128 = (ra_ctx *)0x154602;
  MIR_gen_finish_cold_32();
LAB_00154602:
  prVar49 = prVar51;
  prStack_128 = (ra_ctx *)0x154607;
  MIR_gen_finish_cold_31();
LAB_00154607:
  prStack_128 = (ra_ctx *)0x15460c;
  MIR_gen_finish_cold_30();
LAB_0015460c:
  prVar51 = prVar49;
  prStack_128 = (ra_ctx *)0x154611;
  MIR_gen_finish_cold_29();
LAB_00154611:
  prStack_128 = (ra_ctx *)0x154616;
  MIR_gen_finish_cold_28();
LAB_00154616:
  prVar49 = prVar51;
  prStack_128 = (ra_ctx *)0x15461b;
  MIR_gen_finish_cold_27();
LAB_0015461b:
  prStack_128 = (ra_ctx *)0x154620;
  MIR_gen_finish_cold_26();
LAB_00154620:
  prVar51 = prVar49;
  prStack_128 = (ra_ctx *)0x154625;
  MIR_gen_finish_cold_25();
LAB_00154625:
  prStack_128 = (ra_ctx *)0x15462a;
  MIR_gen_finish_cold_24();
LAB_0015462a:
  prVar49 = prVar51;
  prStack_128 = (ra_ctx *)0x15462f;
  MIR_gen_finish_cold_23();
LAB_0015462f:
  prStack_128 = (ra_ctx *)0x154634;
  MIR_gen_finish_cold_22();
LAB_00154634:
  prVar51 = prVar49;
  prStack_128 = (ra_ctx *)0x154639;
  MIR_gen_finish_cold_21();
LAB_00154639:
  prStack_128 = (ra_ctx *)0x15463e;
  MIR_gen_finish_cold_20();
LAB_0015463e:
  prVar49 = prVar51;
  prStack_128 = (ra_ctx *)0x154643;
  MIR_gen_finish_cold_19();
LAB_00154643:
  prStack_128 = (ra_ctx *)0x154648;
  MIR_gen_finish_cold_18();
LAB_00154648:
  prVar51 = prVar49;
  prStack_128 = (ra_ctx *)0x15464d;
  MIR_gen_finish_cold_17();
LAB_0015464d:
  prStack_128 = (ra_ctx *)0x154652;
  MIR_gen_finish_cold_16();
LAB_00154652:
  prVar49 = prVar51;
  prStack_128 = (ra_ctx *)0x154657;
  MIR_gen_finish_cold_15();
LAB_00154657:
  prStack_128 = (ra_ctx *)0x15465c;
  MIR_gen_finish_cold_14();
LAB_0015465c:
  prVar51 = prVar49;
  prStack_128 = (ra_ctx *)0x154661;
  MIR_gen_finish_cold_13();
  prVar49 = ctx_01;
LAB_00154661:
  prStack_128 = (ra_ctx *)0x154666;
  MIR_gen_finish_cold_12();
  prVar45 = ctx_00;
  ctx_01 = prVar51;
LAB_00154666:
  ctx_00 = prVar45;
  prStack_128 = (ra_ctx *)0x15466b;
  MIR_gen_finish_cold_96();
LAB_0015466b:
  prStack_128 = (ra_ctx *)0x154670;
  MIR_gen_finish_cold_60();
LAB_00154670:
  prStack_128 = (ra_ctx *)0x154675;
  MIR_gen_finish_cold_58();
LAB_00154675:
  prStack_128 = (ra_ctx *)0x15467a;
  MIR_gen_finish_cold_56();
LAB_0015467a:
  prStack_128 = (ra_ctx *)MIR_set_gen_interface;
  MIR_gen_finish_cold_10();
  prStack_150 = ctx_00;
  prStack_148 = prVar31;
  prStack_140 = unaff_R13;
  pgStack_138 = pgVar50;
  prStack_130 = prVar49;
  prStack_128 = prVar48;
  if (prVar46 != (ra_ctx *)0x0) {
    pvVar29 = generate_func_code((MIR_context_t)ctx_01,(MIR_item_t)prVar46,1);
    return pvVar29;
  }
  pgVar50 = *(gen_ctx **)&ctx_01->start_mem_loc;
  pVVar33 = pgVar50->target_ctx->call_refs;
  if (pVVar33 == (VARR_call_ref_t *)0x0) {
LAB_0015488b:
    MIR_set_gen_interface_cold_2();
    if (pgVar50 == (gen_ctx *)0x0) {
      return extraout_RAX_02;
    }
    pvVar29 = _MIR_get_wrapper((MIR_context_t)ctx_01,(MIR_item_t_conflict)pgVar50,
                               generate_func_and_redirect_to_func_code);
    _MIR_redirect_thunk((MIR_context_t)ctx_01,*(void **)&pgVar50->addr_insn_p,pvVar29);
    return extraout_RAX_03;
  }
  sVar56 = pVVar33->els_num;
  if (sVar56 != 0) {
    ppuVar53 = &pVVar33->varr->call_addr;
    pgStack_168 = pgVar50;
    prStack_160 = ctx_01;
    do {
      pMVar28 = (((call_ref_t *)(ppuVar53 + -1))->ref_func_item->u).func;
      puStack_158 = (uint8_t *)pMVar28->machine_code;
      puVar47 = *ppuVar53;
      iStack_16c = *(int *)(puVar47 + 2);
      if (*puVar47 == '@') {
        puVar57 = puVar47 + (long)iStack_16c + 6;
        bVar58 = puVar57 == puStack_158;
        bVar18 = ((long)puStack_158 - (long)(puVar47 + 6)) + 0x80000000U >> 0x20 != 0;
        if (bVar18 || bVar58) {
          bVar22 = false;
          if ((pgVar50->debug_file != (FILE *)0x0) && (bVar22 = false, 1 < pgVar50->debug_level)) {
            ctx_01 = _stderr;
            fprintf((FILE *)_stderr,
                    "Failing to make direct 32-bit call of func %s at 0x%llx (addr: before=0x%llx, after=0x%llx)\n"
                    ,pMVar28->name,puVar47,puVar57);
            bVar22 = false;
            pgVar50 = pgStack_168;
          }
        }
        else {
          iStack_16c = (int)((long)puStack_158 - (long)(puVar47 + 6));
          ctx_01 = prStack_160;
          _MIR_change_code((MIR_context_t)prStack_160,puVar47 + 2,(uint8_t *)&iStack_16c,4);
          pgVar50 = pgStack_168;
          bVar22 = true;
        }
        if (!bVar18 && !bVar58) goto LAB_001547ac;
      }
      else {
        if (*puVar47 != 0xff) {
          __assert_fail("call_addr[0] == 0x40",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0xbb6,"void target_change_to_direct_calls(MIR_context_t)");
        }
        puVar57 = *(uint8_t **)(puVar47 + (long)iStack_16c + 6);
        if (puStack_158 != puVar57) {
          puVar47 = puVar47 + (long)iStack_16c + 6;
          ctx_01 = prStack_160;
          _MIR_change_code((MIR_context_t)prStack_160,puVar47,(uint8_t *)&puStack_158,8);
          bVar22 = false;
          pgVar50 = pgStack_168;
LAB_001547ac:
          if ((pgVar50->debug_file != (FILE *)0x0) && (1 < pgVar50->debug_level)) {
            pcVar41 = "32";
            if (!bVar22) {
              pcVar41 = "64";
            }
            ctx_01 = _stderr;
            fprintf((FILE *)_stderr,
                    "Making direct %s-bit call of func %s at 0x%llx (addr: before=0x%llx, after=0x%llx)\n"
                    ,pcVar41,pMVar28->name,puVar47,puVar57,puStack_158);
            pgVar50 = pgStack_168;
          }
        }
      }
      ppuVar53 = ppuVar53 + 2;
      sVar56 = sVar56 - 1;
    } while (sVar56 != 0);
    pVVar33 = pgVar50->target_ctx->call_refs;
    if ((pVVar33 == (VARR_call_ref_t *)0x0) || (pVVar33->varr == (call_ref_t *)0x0)) {
      MIR_set_gen_interface_cold_1();
      goto LAB_0015488b;
    }
    pVVar33->els_num = 0;
  }
  return pVVar33;
LAB_00152ef3:
  prStack_100 = (ra_ctx *)0x152ef8;
  bb_version_generator_cold_9();
LAB_00152ef8:
  prStack_100 = (ra_ctx *)0x152efd;
  bb_version_generator_cold_33();
LAB_00152efd:
  prStack_100 = (ra_ctx *)0x152f02;
  bb_version_generator_cold_8();
LAB_00152f02:
  prStack_100 = (ra_ctx *)0x152f07;
  bb_version_generator_cold_30();
LAB_00152f07:
  prStack_100 = (ra_ctx *)0x152f0c;
  bb_version_generator_cold_12();
LAB_00152f0c:
  prStack_100 = (ra_ctx *)0x152f11;
  bb_version_generator_cold_37();
LAB_00152f11:
  prStack_100 = (ra_ctx *)0x152f16;
  bb_version_generator_cold_19();
LAB_00152f16:
  prStack_100 = (ra_ctx *)0x152f1b;
  bb_version_generator_cold_35();
LAB_00152f1b:
  prStack_100 = (ra_ctx *)0x152f20;
  bb_version_generator_cold_34();
LAB_00152f20:
  prStack_100 = (ra_ctx *)0x152f25;
  bb_version_generator_cold_26();
LAB_00152f25:
  prStack_100 = (ra_ctx *)0x152f2a;
  bb_version_generator_cold_27();
LAB_00152f2a:
  prStack_100 = (ra_ctx *)0x152f32;
  bb_version_generator_cold_20();
LAB_00152f32:
  prStack_100 = (ra_ctx *)0x152f3a;
  bb_version_generator_cold_22();
LAB_00152f3a:
  prStack_100 = (ra_ctx *)0x152f3f;
  bb_version_generator_cold_11();
LAB_00152f3f:
  prStack_100 = (ra_ctx *)0x152f44;
  bb_version_generator_cold_3();
LAB_00152f44:
  prStack_100 = (ra_ctx *)0x152f49;
  bb_version_generator_cold_5();
LAB_00152f49:
  prStack_100 = (ra_ctx *)0x152f4e;
  bb_version_generator_cold_7();
LAB_00152f4e:
  prStack_100 = (ra_ctx *)0x152f53;
  bb_version_generator_cold_10();
LAB_00152f53:
  prStack_100 = (ra_ctx *)0x152f58;
  bb_version_generator_cold_48();
LAB_00152f58:
  prStack_100 = (ra_ctx *)0x152f5d;
  bb_version_generator_cold_47();
LAB_00152f5d:
  prStack_100 = (ra_ctx *)0x152f62;
  bb_version_generator_cold_46();
LAB_00152f62:
  prStack_100 = (ra_ctx *)0x152f67;
  bb_version_generator_cold_45();
LAB_00152f67:
  prStack_100 = (ra_ctx *)0x152f6c;
  bb_version_generator_cold_44();
LAB_00152f6c:
  prStack_100 = (ra_ctx *)0x152f71;
  bb_version_generator_cold_55();
LAB_00152f71:
  prStack_100 = (ra_ctx *)0x152f76;
  bb_version_generator_cold_54();
LAB_00152f76:
  prStack_100 = (ra_ctx *)0x152f7b;
  bb_version_generator_cold_53();
LAB_00152f7b:
  prStack_100 = (ra_ctx *)0x152f80;
  bb_version_generator_cold_52();
LAB_00152f80:
  prStack_100 = (ra_ctx *)0x152f85;
  bb_version_generator_cold_51();
LAB_00152f85:
  prStack_100 = (ra_ctx *)0x152f8a;
  bb_version_generator_cold_50();
LAB_00152f8a:
  prStack_100 = (ra_ctx *)0x152f8f;
  bb_version_generator_cold_49();
LAB_00152f8f:
  prStack_100 = (ra_ctx *)0x152f94;
  bb_version_generator_cold_43();
LAB_00152f94:
  prStack_100 = (ra_ctx *)0x152f99;
  bb_version_generator_cold_42();
LAB_00152f99:
  prStack_100 = (ra_ctx *)0x152f9e;
  bb_version_generator_cold_29();
LAB_00152f9e:
  prStack_100 = (ra_ctx *)0x152fbd;
  __assert_fail("curr_insn->ops[2].mode == MIR_OP_INT || curr_insn->ops[2].mode == MIR_OP_UINT",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x264a,"void generate_bb_version_machine_code(gen_ctx_t, bb_version_t)");
}

Assistant:

static void generate_bb_version_machine_code (gen_ctx_t gen_ctx, bb_version_t bb_version) {
  MIR_context_t ctx = gen_ctx->ctx;
  int skip_p;
  bb_stub_t branch_bb_stub, bb_stub = bb_version->bb_stub;
  MIR_insn_t curr_insn, new_insn, next_insn;
  void *addr;
  uint8_t *code;
  size_t code_len, nel;
  uint32_t prop, spot, dest_spot, src_spot, max_spot = 0;
  bitmap_t nonzero_property_spots = temp_bitmap;
  bitmap_iterator_t bi;
  spot_attr_t spot_attr;

  bitmap_clear (nonzero_property_spots);
  DEBUG (2, {
    fprintf (debug_file, "  IN BBStub%llx nonzero properties: ", (long long unsigned) bb_stub);
  });
  for (size_t i = 0; i < bb_version->n_attrs; i++) {
    bitmap_set_bit_p (nonzero_property_spots, bb_version->attrs[i].spot);
    set_spot2attr (gen_ctx, &bb_version->attrs[i]);
    DEBUG (2, {
      if (i != 0) fprintf (debug_file, ", ");
      fprintf (debug_file, "(spot=%u,prop=%u)", (unsigned) bb_version->attrs[i].spot,
               (unsigned) bb_version->attrs[i].prop);
    });
  }
  DEBUG (2, { fprintf (debug_file, "\n"); });
  if (bb_version->n_attrs != 0) max_spot = bb_version->attrs[bb_version->n_attrs - 1].spot;
  VARR_TRUNC (target_bb_version_t, target_succ_bb_versions, 0);
  target_bb_translate_start (gen_ctx);
  for (curr_insn = bb_stub->first_insn;; curr_insn = next_insn) {
    next_insn = DLIST_NEXT (MIR_insn_t, curr_insn);
    if (MIR_any_branch_code_p (curr_insn->code)) break;
    skip_p = FALSE;
    switch (curr_insn->code) {
    case MIR_USE: skip_p = TRUE; break;
    case MIR_PRSET:
      gen_assert (curr_insn->ops[1].mode == MIR_OP_INT || curr_insn->ops[1].mode == MIR_OP_UINT);
      dest_spot = op2spot (&curr_insn->ops[0]);
      if (dest_spot == 0) {
      } else if (curr_insn->ops[1].u.i == 0) { /* ??? aliased */
        bitmap_clear_bit_p (nonzero_property_spots, dest_spot);
      } else {
        bitmap_set_bit_p (nonzero_property_spots, dest_spot);
        spot_attr.spot = dest_spot;
        spot_attr.prop = (uint32_t) curr_insn->ops[1].u.i;
        spot_attr.mem_ref = mem_spot_p (dest_spot) ? &curr_insn->ops[0] : NULL;
        set_spot2attr (gen_ctx, &spot_attr);
      }
      skip_p = TRUE;
      break;
    case MIR_PRBEQ:
    case MIR_PRBNE:
      gen_assert (curr_insn->ops[2].mode == MIR_OP_INT || curr_insn->ops[2].mode == MIR_OP_UINT);
      spot = op2spot (&curr_insn->ops[1]);
      prop = 0;
      if (bitmap_bit_p (nonzero_property_spots, spot)) {
        spot_attr = VARR_GET (spot_attr_t, spot2attr, spot);
        prop = spot_attr.prop;
      }
      if ((curr_insn->code == MIR_PRBEQ && curr_insn->ops[2].u.i != prop)
          || (curr_insn->code == MIR_PRBNE && curr_insn->ops[2].u.i == prop)) {
        DEBUG (2, {
          fprintf (debug_file, "  Remove property insn ");
          MIR_output_insn (ctx, debug_file, curr_insn, curr_func_item->u.func, TRUE);
        });
        MIR_remove_insn (ctx, curr_func_item, curr_insn);
        skip_p = TRUE;
        break;
      } else { /* make unconditional jump */
        new_insn = MIR_new_insn (ctx, MIR_JMP, curr_insn->ops[0]);
        MIR_insert_insn_before (ctx, curr_func_item, curr_insn, new_insn);
        DEBUG (2, {
          fprintf (debug_file, "  Change ");
          MIR_output_insn (ctx, debug_file, curr_insn, curr_func_item->u.func, FALSE);
          fprintf (debug_file, " to ");
          MIR_output_insn (ctx, debug_file, new_insn, curr_func_item->u.func, TRUE);
        });
        MIR_remove_insn (ctx, curr_func_item, curr_insn);
        next_insn = new_insn;
        continue;
      }
    case MIR_MOV:
    case MIR_FMOV:
    case MIR_DMOV:
    case MIR_LDMOV:
      dest_spot = op2spot (&curr_insn->ops[0]);
      src_spot = op2spot (&curr_insn->ops[1]);
      if (src_spot == 0) {
        bitmap_clear_bit_p (nonzero_property_spots, dest_spot);
      } else if (dest_spot == 0) { /* clear attrs of all memory locations */
        if (max_spot >= FIRST_MEM_SPOT)
          bitmap_clear_bit_range_p (nonzero_property_spots, FIRST_MEM_SPOT,
                                    max_spot - FIRST_MEM_SPOT + 1);
      } else if (bitmap_bit_p (nonzero_property_spots, src_spot)) {
        spot_attr = VARR_GET (spot_attr_t, spot2attr, src_spot);
        spot_attr.mem_ref = NULL;
        if (mem_spot_p (dest_spot)) {
          spot_attr_t *spot_attr_addr = VARR_ADDR (spot_attr_t, spot_attrs);
          for (spot = FIRST_MEM_SPOT; spot <= max_spot; spot++)
            if (may_mem_alias_p (spot_attr_addr[dest_spot].mem_ref, spot_attr_addr[spot].mem_ref))
              bitmap_clear_bit_p (nonzero_property_spots, spot);
          spot_attr.mem_ref = &curr_insn->ops[0];
        }
        bitmap_set_bit_p (nonzero_property_spots, dest_spot);
        spot_attr.spot = dest_spot;
        set_spot2attr (gen_ctx, &spot_attr);
      }
      break;
    default: break;
    }
    if (!skip_p) {
      if (curr_insn->code != MIR_LADDR) {
        target_bb_insn_translate (gen_ctx, curr_insn, NULL);
      } else {
        VARR_TRUNC (spot_attr_t, spot_attrs, 0);
        FOREACH_BITMAP_BIT (bi, nonzero_property_spots, nel) {
          VARR_PUSH (spot_attr_t, spot_attrs, VARR_GET (spot_attr_t, spot2attr, nel));
        }
        VARR_TRUNC (void_ptr_t, succ_bb_addrs, 0);
        branch_bb_stub = curr_insn->ops[1].u.label->data;
        (void) get_bb_version (gen_ctx, branch_bb_stub,
                               (uint32_t) VARR_LENGTH (spot_attr_t, spot_attrs),
                               VARR_ADDR (spot_attr_t, spot_attrs), FALSE, &addr);
        VARR_PUSH (void_ptr_t, succ_bb_addrs, addr);
        target_bb_insn_translate (gen_ctx, curr_insn, VARR_ADDR (void_ptr_t, succ_bb_addrs));
      }
    }
    if (curr_insn == bb_stub->last_insn) break;
  }
  VARR_TRUNC (spot_attr_t, spot_attrs, 0);
  DEBUG (2, {
    fprintf (debug_file, "  OUT BBStub%llx nonzero properties: ", (long long unsigned) bb_stub);
  });
  FOREACH_BITMAP_BIT (bi, nonzero_property_spots, nel) {
    if (MIR_call_code_p (curr_insn->code) && mem_spot_p ((uint32_t) nel)) break;
    spot_attr = VARR_GET (spot_attr_t, spot2attr, nel);
    DEBUG (2, {
      if (VARR_LENGTH (spot_attr_t, spot_attrs) != 0) fprintf (debug_file, ", ");
      fprintf (debug_file, "(spot=%u,prop=%u)", (unsigned) spot_attr.spot,
               (unsigned) spot_attr.prop);
    });
    VARR_PUSH (spot_attr_t, spot_attrs, spot_attr);
  }
  DEBUG (2, { fprintf (debug_file, "\n"); });
  VARR_TRUNC (void_ptr_t, succ_bb_addrs, 0);
  if (curr_insn->code == MIR_JMPI) {
    target_bb_insn_translate (gen_ctx, curr_insn, NULL);
  } else if (curr_insn->code == MIR_SWITCH) {
    for (size_t i = 1; i < curr_insn->nops; i++) {
      branch_bb_stub = curr_insn->ops[i].u.label->data;
      (void) get_bb_version (gen_ctx, branch_bb_stub,
                             (uint32_t) VARR_LENGTH (spot_attr_t, spot_attrs),
                             VARR_ADDR (spot_attr_t, spot_attrs), FALSE, &addr);
      VARR_PUSH (void_ptr_t, succ_bb_addrs, addr);
    }
    target_bb_insn_translate (gen_ctx, curr_insn, VARR_ADDR (void_ptr_t, succ_bb_addrs));
  } else if (MIR_branch_code_p (curr_insn->code)) {  // ??? generate branch
    branch_bb_stub = curr_insn->ops[0].u.label->data;
    (void) get_bb_version (gen_ctx, branch_bb_stub,
                           (uint32_t) VARR_LENGTH (spot_attr_t, spot_attrs),
                           VARR_ADDR (spot_attr_t, spot_attrs), FALSE, &addr);
    VARR_PUSH (void_ptr_t, succ_bb_addrs, addr);
    target_bb_insn_translate (gen_ctx, curr_insn, VARR_ADDR (void_ptr_t, succ_bb_addrs));
  }
  if (curr_insn->code != MIR_JMP && curr_insn->code != MIR_JMPI && curr_insn->code != MIR_SWITCH
      && curr_insn->code != MIR_RET && curr_insn->code != MIR_JRET) {
    VARR_TRUNC (void_ptr_t, succ_bb_addrs, 0);
    (void) get_bb_version (gen_ctx, bb_stub + 1, (uint32_t) VARR_LENGTH (spot_attr_t, spot_attrs),
                           VARR_ADDR (spot_attr_t, spot_attrs), FALSE, &addr);
    VARR_PUSH (void_ptr_t, succ_bb_addrs, addr);
    target_output_jump (gen_ctx, VARR_ADDR (void_ptr_t, succ_bb_addrs));
  }
  code = target_bb_translate_finish (gen_ctx, &code_len);
  addr = _MIR_publish_code (ctx, code, code_len);
  target_bb_rebase (gen_ctx, addr);
  target_setup_succ_bb_version_data (gen_ctx, addr);
  DEBUG (1, {
    _MIR_dump_code (NULL, addr, code_len);
    fprintf (debug_file, "BBStub%llx code size = %lu:\n", (unsigned long long) bb_stub,
             (unsigned long) code_len);
  });
  target_redirect_bb_origin_branch (gen_ctx, &bb_version->target_data, addr);
  _MIR_replace_bb_thunk (ctx, bb_version->addr, addr);
  bb_version->addr = addr;
  overall_gen_bbs_num++;
  bb_version->machine_code = addr;
}